

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [28];
  undefined1 auVar26 [28];
  undefined1 auVar27 [28];
  undefined1 auVar28 [28];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  byte bVar36;
  uint uVar37;
  ulong uVar38;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong uVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar58 [16];
  undefined1 auVar84 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar68 [16];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float t1;
  float fVar129;
  undefined4 uVar130;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vfloat4 a0_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vfloat4 b0;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  vfloat4 a0_3;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  __m128 a_1;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  __m128 a;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar219;
  float fVar220;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar221;
  float fVar231;
  float fVar232;
  vfloat4 a0_1;
  float fVar233;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar240;
  float fVar241;
  vfloat4 a0;
  undefined1 auVar235 [16];
  float fVar242;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_478;
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar39;
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  uint uVar119;
  undefined1 auVar246 [32];
  
  PVar4 = prim[1];
  uVar42 = (ulong)(byte)PVar4;
  fVar143 = *(float *)(prim + uVar42 * 0x19 + 0x12);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar58 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar52 = vsubps_avx(auVar50,*(undefined1 (*) [16])(prim + uVar42 * 0x19 + 6));
  fVar142 = fVar143 * auVar52._0_4_;
  fVar120 = fVar143 * auVar58._0_4_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar42 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar50);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar42 * 5 + 6);
  auVar79 = vpmovsxbd_avx2(auVar54);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar42 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar3);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar42 * 0xb + 6);
  auVar96 = vpmovsxbd_avx2(auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar90 = vpmovsxbd_avx2(auVar60);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vcvtdq2ps_avx(auVar90);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar42 + 6);
  auVar80 = vpmovsxbd_avx2(auVar56);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar44 = (ulong)(uint)((int)(uVar42 * 9) * 2);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar44 + 6);
  auVar87 = vpmovsxbd_avx2(auVar57);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar44 + uVar42 + 6);
  auVar88 = vpmovsxbd_avx2(auVar51);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar38 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar78 = vpmovsxbd_avx2(auVar55);
  auVar89 = vcvtdq2ps_avx(auVar78);
  auVar163._4_4_ = fVar120;
  auVar163._0_4_ = fVar120;
  auVar163._8_4_ = fVar120;
  auVar163._12_4_ = fVar120;
  auVar163._16_4_ = fVar120;
  auVar163._20_4_ = fVar120;
  auVar163._24_4_ = fVar120;
  auVar163._28_4_ = fVar120;
  auVar253._8_4_ = 1;
  auVar253._0_8_ = 0x100000001;
  auVar253._12_4_ = 1;
  auVar253._16_4_ = 1;
  auVar253._20_4_ = 1;
  auVar253._24_4_ = 1;
  auVar253._28_4_ = 1;
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar261 = ZEXT3264(auVar76);
  auVar92 = ZEXT1632(CONCAT412(fVar143 * auVar58._12_4_,
                               CONCAT48(fVar143 * auVar58._8_4_,
                                        CONCAT44(fVar143 * auVar58._4_4_,fVar120))));
  auVar91 = vpermps_avx2(auVar253,auVar92);
  auVar77 = vpermps_avx512vl(auVar76,auVar92);
  fVar120 = auVar77._0_4_;
  fVar210 = auVar77._4_4_;
  auVar92._4_4_ = fVar210 * auVar86._4_4_;
  auVar92._0_4_ = fVar120 * auVar86._0_4_;
  fVar219 = auVar77._8_4_;
  auVar92._8_4_ = fVar219 * auVar86._8_4_;
  fVar220 = auVar77._12_4_;
  auVar92._12_4_ = fVar220 * auVar86._12_4_;
  fVar126 = auVar77._16_4_;
  auVar92._16_4_ = fVar126 * auVar86._16_4_;
  fVar127 = auVar77._20_4_;
  auVar92._20_4_ = fVar127 * auVar86._20_4_;
  fVar128 = auVar77._24_4_;
  auVar92._24_4_ = fVar128 * auVar86._24_4_;
  auVar92._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar80._4_4_ * fVar210;
  auVar90._0_4_ = auVar80._0_4_ * fVar120;
  auVar90._8_4_ = auVar80._8_4_ * fVar219;
  auVar90._12_4_ = auVar80._12_4_ * fVar220;
  auVar90._16_4_ = auVar80._16_4_ * fVar126;
  auVar90._20_4_ = auVar80._20_4_ * fVar127;
  auVar90._24_4_ = auVar80._24_4_ * fVar128;
  auVar90._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar89._4_4_ * fVar210;
  auVar78._0_4_ = auVar89._0_4_ * fVar120;
  auVar78._8_4_ = auVar89._8_4_ * fVar219;
  auVar78._12_4_ = auVar89._12_4_ * fVar220;
  auVar78._16_4_ = auVar89._16_4_ * fVar126;
  auVar78._20_4_ = auVar89._20_4_ * fVar127;
  auVar78._24_4_ = auVar89._24_4_ * fVar128;
  auVar78._28_4_ = auVar77._28_4_;
  auVar50 = vfmadd231ps_fma(auVar92,auVar91,auVar79);
  auVar54 = vfmadd231ps_fma(auVar90,auVar91,auVar97);
  auVar3 = vfmadd231ps_fma(auVar78,auVar88,auVar91);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar163,auVar81);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar163,auVar96);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar87,auVar163);
  auVar239._4_4_ = fVar142;
  auVar239._0_4_ = fVar142;
  auVar239._8_4_ = fVar142;
  auVar239._12_4_ = fVar142;
  auVar239._16_4_ = fVar142;
  auVar239._20_4_ = fVar142;
  auVar239._24_4_ = fVar142;
  auVar239._28_4_ = fVar142;
  auVar78 = ZEXT1632(CONCAT412(fVar143 * auVar52._12_4_,
                               CONCAT48(fVar143 * auVar52._8_4_,
                                        CONCAT44(fVar143 * auVar52._4_4_,fVar142))));
  auVar90 = vpermps_avx2(auVar253,auVar78);
  auVar78 = vpermps_avx512vl(auVar76,auVar78);
  fVar143 = auVar78._0_4_;
  fVar120 = auVar78._4_4_;
  auVar91._4_4_ = fVar120 * auVar86._4_4_;
  auVar91._0_4_ = fVar143 * auVar86._0_4_;
  fVar210 = auVar78._8_4_;
  auVar91._8_4_ = fVar210 * auVar86._8_4_;
  fVar219 = auVar78._12_4_;
  auVar91._12_4_ = fVar219 * auVar86._12_4_;
  fVar220 = auVar78._16_4_;
  auVar91._16_4_ = fVar220 * auVar86._16_4_;
  fVar126 = auVar78._20_4_;
  auVar91._20_4_ = fVar126 * auVar86._20_4_;
  fVar127 = auVar78._24_4_;
  auVar91._24_4_ = fVar127 * auVar86._24_4_;
  auVar91._28_4_ = 1;
  auVar76._4_4_ = auVar80._4_4_ * fVar120;
  auVar76._0_4_ = auVar80._0_4_ * fVar143;
  auVar76._8_4_ = auVar80._8_4_ * fVar210;
  auVar76._12_4_ = auVar80._12_4_ * fVar219;
  auVar76._16_4_ = auVar80._16_4_ * fVar220;
  auVar76._20_4_ = auVar80._20_4_ * fVar126;
  auVar76._24_4_ = auVar80._24_4_ * fVar127;
  auVar76._28_4_ = auVar86._28_4_;
  auVar80._4_4_ = auVar89._4_4_ * fVar120;
  auVar80._0_4_ = auVar89._0_4_ * fVar143;
  auVar80._8_4_ = auVar89._8_4_ * fVar210;
  auVar80._12_4_ = auVar89._12_4_ * fVar219;
  auVar80._16_4_ = auVar89._16_4_ * fVar220;
  auVar80._20_4_ = auVar89._20_4_ * fVar126;
  auVar80._24_4_ = auVar89._24_4_ * fVar127;
  auVar80._28_4_ = auVar78._28_4_;
  auVar59 = vfmadd231ps_fma(auVar91,auVar90,auVar79);
  auVar60 = vfmadd231ps_fma(auVar76,auVar90,auVar97);
  auVar56 = vfmadd231ps_fma(auVar80,auVar90,auVar88);
  auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar239,auVar81);
  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar239,auVar96);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar239,auVar87);
  auVar81 = vandps_avx(ZEXT1632(auVar50),auVar99);
  auVar154._8_4_ = 0x219392ef;
  auVar154._0_8_ = 0x219392ef219392ef;
  auVar154._12_4_ = 0x219392ef;
  auVar154._16_4_ = 0x219392ef;
  auVar154._20_4_ = 0x219392ef;
  auVar154._24_4_ = 0x219392ef;
  auVar154._28_4_ = 0x219392ef;
  uVar44 = vcmpps_avx512vl(auVar81,auVar154,1);
  bVar48 = (bool)((byte)uVar44 & 1);
  auVar77._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._0_4_;
  bVar48 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._4_4_;
  bVar48 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._8_4_;
  bVar48 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar50._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar54),auVar99);
  uVar44 = vcmpps_avx512vl(auVar81,auVar154,1);
  bVar48 = (bool)((byte)uVar44 & 1);
  auVar93._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._0_4_;
  bVar48 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._4_4_;
  bVar48 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._8_4_;
  bVar48 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar54._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar3),auVar99);
  uVar44 = vcmpps_avx512vl(auVar81,auVar154,1);
  bVar48 = (bool)((byte)uVar44 & 1);
  auVar81._0_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar3._0_4_;
  bVar48 = (bool)((byte)(uVar44 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar3._4_4_;
  bVar48 = (bool)((byte)(uVar44 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar3._8_4_;
  bVar48 = (bool)((byte)(uVar44 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar48 * 0x219392ef | (uint)!bVar48 * auVar3._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar44 >> 7) * 0x219392ef;
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar50 = vfnmadd213ps_fma(auVar77,auVar79,auVar100);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar93);
  auVar54 = vfnmadd213ps_fma(auVar93,auVar79,auVar100);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar81);
  auVar3 = vfnmadd213ps_fma(auVar81,auVar79,auVar100);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar79,auVar79);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 7 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar59));
  auVar87._4_4_ = auVar50._4_4_ * auVar81._4_4_;
  auVar87._0_4_ = auVar50._0_4_ * auVar81._0_4_;
  auVar87._8_4_ = auVar50._8_4_ * auVar81._8_4_;
  auVar87._12_4_ = auVar50._12_4_ * auVar81._12_4_;
  auVar87._16_4_ = auVar81._16_4_ * 0.0;
  auVar87._20_4_ = auVar81._20_4_ * 0.0;
  auVar87._24_4_ = auVar81._24_4_ * 0.0;
  auVar87._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 9 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar59));
  auVar80 = vpbroadcastd_avx512vl();
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar98._0_4_ = auVar50._0_4_ * auVar81._0_4_;
  auVar98._4_4_ = auVar50._4_4_ * auVar81._4_4_;
  auVar98._8_4_ = auVar50._8_4_ * auVar81._8_4_;
  auVar98._12_4_ = auVar50._12_4_ * auVar81._12_4_;
  auVar98._16_4_ = auVar81._16_4_ * 0.0;
  auVar98._20_4_ = auVar81._20_4_ * 0.0;
  auVar98._24_4_ = auVar81._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar42 * -2 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar60));
  auVar88._4_4_ = auVar54._4_4_ * auVar81._4_4_;
  auVar88._0_4_ = auVar54._0_4_ * auVar81._0_4_;
  auVar88._8_4_ = auVar54._8_4_ * auVar81._8_4_;
  auVar88._12_4_ = auVar54._12_4_ * auVar81._12_4_;
  auVar88._16_4_ = auVar81._16_4_ * 0.0;
  auVar88._20_4_ = auVar81._20_4_ * 0.0;
  auVar88._24_4_ = auVar81._24_4_ * 0.0;
  auVar88._28_4_ = auVar81._28_4_;
  auVar81 = vcvtdq2ps_avx(auVar79);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar60));
  auVar95._0_4_ = auVar54._0_4_ * auVar81._0_4_;
  auVar95._4_4_ = auVar54._4_4_ * auVar81._4_4_;
  auVar95._8_4_ = auVar54._8_4_ * auVar81._8_4_;
  auVar95._12_4_ = auVar54._12_4_ * auVar81._12_4_;
  auVar95._16_4_ = auVar81._16_4_ * 0.0;
  auVar95._20_4_ = auVar81._20_4_ * 0.0;
  auVar95._24_4_ = auVar81._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 + uVar42 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar56));
  auVar89._4_4_ = auVar81._4_4_ * auVar3._4_4_;
  auVar89._0_4_ = auVar81._0_4_ * auVar3._0_4_;
  auVar89._8_4_ = auVar81._8_4_ * auVar3._8_4_;
  auVar89._12_4_ = auVar81._12_4_ * auVar3._12_4_;
  auVar89._16_4_ = auVar81._16_4_ * 0.0;
  auVar89._20_4_ = auVar81._20_4_ * 0.0;
  auVar89._24_4_ = auVar81._24_4_ * 0.0;
  auVar89._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 0x17 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar56));
  auVar94._0_4_ = auVar3._0_4_ * auVar81._0_4_;
  auVar94._4_4_ = auVar3._4_4_ * auVar81._4_4_;
  auVar94._8_4_ = auVar3._8_4_ * auVar81._8_4_;
  auVar94._12_4_ = auVar3._12_4_ * auVar81._12_4_;
  auVar94._16_4_ = auVar81._16_4_ * 0.0;
  auVar94._20_4_ = auVar81._20_4_ * 0.0;
  auVar94._24_4_ = auVar81._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar87,auVar98);
  auVar79 = vpminsd_avx2(auVar88,auVar95);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79 = vpminsd_avx2(auVar89,auVar94);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar86._4_4_ = uVar130;
  auVar86._0_4_ = uVar130;
  auVar86._8_4_ = uVar130;
  auVar86._12_4_ = uVar130;
  auVar86._16_4_ = uVar130;
  auVar86._20_4_ = uVar130;
  auVar86._24_4_ = uVar130;
  auVar86._28_4_ = uVar130;
  auVar79 = vmaxps_avx512vl(auVar79,auVar86);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79._8_4_ = 0x3f7ffffa;
  auVar79._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar79._12_4_ = 0x3f7ffffa;
  auVar79._16_4_ = 0x3f7ffffa;
  auVar79._20_4_ = 0x3f7ffffa;
  auVar79._24_4_ = 0x3f7ffffa;
  auVar79._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar81,auVar79);
  auVar81 = vpmaxsd_avx2(auVar87,auVar98);
  auVar79 = vpmaxsd_avx2(auVar88,auVar95);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar79 = vpmaxsd_avx2(auVar89,auVar94);
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar130;
  auVar96._0_4_ = uVar130;
  auVar96._8_4_ = uVar130;
  auVar96._12_4_ = uVar130;
  auVar96._16_4_ = uVar130;
  auVar96._20_4_ = uVar130;
  auVar96._24_4_ = uVar130;
  auVar96._28_4_ = uVar130;
  auVar79 = vminps_avx512vl(auVar79,auVar96);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar97._8_4_ = 0x3f800003;
  auVar97._0_8_ = 0x3f8000033f800003;
  auVar97._12_4_ = 0x3f800003;
  auVar97._16_4_ = 0x3f800003;
  auVar97._20_4_ = 0x3f800003;
  auVar97._24_4_ = 0x3f800003;
  auVar97._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar97);
  uVar14 = vpcmpgtd_avx512vl(auVar80,_DAT_01fe9900);
  uVar13 = vcmpps_avx512vl(local_1c0,auVar81,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) != 0) {
    uVar44 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
    local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar114._16_16_ = auVar81._16_16_;
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar254 = ZEXT1664(auVar50);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar256 = ZEXT1664(auVar50);
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar257 = ZEXT1664(auVar50);
    auVar263 = ZEXT464(0x3f800000);
    auVar114._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar262 = ZEXT1664(auVar114._0_16_);
    do {
      lVar40 = 0;
      for (uVar38 = uVar44; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar45 = *(uint *)(prim + 2);
      uVar5 = *(uint *)(prim + lVar40 * 4 + 6);
      pGVar6 = (context->scene->geometries).items[uVar45].ptr;
      lVar7 = *(long *)&pGVar6[1].time_range.upper;
      uVar38 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               (ulong)uVar5 *
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar50 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar38);
      lVar40 = uVar38 + 1;
      auVar54 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar40);
      _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar3 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar38);
      auVar59 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar40);
      auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar60 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      fVar143 = *(float *)(ray + k * 4 + 0x60);
      auVar247._8_4_ = 0x3eaaaaab;
      auVar247._0_8_ = 0x3eaaaaab3eaaaaab;
      auVar247._12_4_ = 0x3eaaaaab;
      auVar56 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar6[2].intersectionFilterN +
                                 (long)pGVar6[2].pointQueryFunc * uVar38),auVar50,auVar247);
      auVar55 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar6[2].intersectionFilterN +
                                  (long)pGVar6[2].pointQueryFunc * lVar40),auVar54,auVar247);
      auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 ((long)pGVar6[3].userPtr +
                                 uVar38 * *(long *)&pGVar6[3].fnumTimeSegments),auVar3,auVar247);
      auVar58 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  ((long)pGVar6[3].userPtr +
                                  *(long *)&pGVar6[3].fnumTimeSegments * lVar40),auVar59,auVar247);
      auVar83._16_16_ = auVar114._16_16_;
      auVar83._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar51 = vmulps_avx512vl(auVar54,auVar83._0_16_);
      auVar52 = vfmadd231ps_avx512vl(auVar51,auVar55,auVar83._0_16_);
      auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar56,auVar52);
      auVar61._0_4_ = auVar50._0_4_ + auVar51._0_4_;
      auVar61._4_4_ = auVar50._4_4_ + auVar51._4_4_;
      auVar61._8_4_ = auVar50._8_4_ + auVar51._8_4_;
      auVar61._12_4_ = auVar50._12_4_ + auVar51._12_4_;
      auVar131 = auVar254._0_16_;
      auVar51 = vfmadd231ps_avx512vl(auVar52,auVar56,auVar131);
      auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar50,auVar131);
      auVar51 = vmulps_avx512vl(auVar59,auVar83._0_16_);
      auVar53 = vfmadd231ps_avx512vl(auVar51,auVar58,auVar83._0_16_);
      auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar57,auVar53);
      auVar235._0_4_ = auVar3._0_4_ + auVar51._0_4_;
      auVar235._4_4_ = auVar3._4_4_ + auVar51._4_4_;
      auVar235._8_4_ = auVar3._8_4_ + auVar51._8_4_;
      auVar235._12_4_ = auVar3._12_4_ + auVar51._12_4_;
      auVar51 = vfmadd231ps_avx512vl(auVar53,auVar57,auVar131);
      auVar53 = vfnmadd231ps_avx512vl(auVar51,auVar3,auVar131);
      auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar55,auVar54);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar56,auVar83._0_16_);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar50,auVar83._0_16_);
      auVar54 = vmulps_avx512vl(auVar54,auVar131);
      auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar131,auVar55);
      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar83._0_16_,auVar56);
      auVar55 = vfnmadd231ps_avx512vl(auVar54,auVar83._0_16_,auVar50);
      auVar50 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar58,auVar59);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar57,auVar83._0_16_);
      auVar56 = vfmadd231ps_avx512vl(auVar50,auVar3,auVar83._0_16_);
      auVar50 = vmulps_avx512vl(auVar59,auVar131);
      auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar131,auVar58);
      auVar50 = vfmadd231ps_avx512vl(auVar50,auVar83._0_16_,auVar57);
      auVar57 = vfnmadd231ps_avx512vl(auVar50,auVar83._0_16_,auVar3);
      auVar50 = vshufps_avx(auVar52,auVar52,0xc9);
      auVar54 = vshufps_avx(auVar235,auVar235,0xc9);
      fVar129 = auVar52._0_4_;
      auVar74._0_4_ = fVar129 * auVar54._0_4_;
      fVar134 = auVar52._4_4_;
      auVar74._4_4_ = fVar134 * auVar54._4_4_;
      fVar135 = auVar52._8_4_;
      auVar74._8_4_ = fVar135 * auVar54._8_4_;
      fVar136 = auVar52._12_4_;
      auVar74._12_4_ = fVar136 * auVar54._12_4_;
      auVar54 = vfmsub231ps_fma(auVar74,auVar50,auVar235);
      auVar3 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar192._0_4_ = auVar54._0_4_ * fVar129;
      auVar192._4_4_ = auVar54._4_4_ * fVar134;
      auVar192._8_4_ = auVar54._8_4_ * fVar135;
      auVar192._12_4_ = auVar54._12_4_ * fVar136;
      auVar50 = vfmsub231ps_fma(auVar192,auVar50,auVar53);
      auVar59 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar50 = vshufps_avx(auVar55,auVar55,0xc9);
      auVar54 = vshufps_avx(auVar56,auVar56,0xc9);
      fVar120 = auVar55._0_4_;
      auVar202._0_4_ = auVar54._0_4_ * fVar120;
      fVar210 = auVar55._4_4_;
      auVar202._4_4_ = auVar54._4_4_ * fVar210;
      fVar219 = auVar55._8_4_;
      auVar202._8_4_ = auVar54._8_4_ * fVar219;
      fVar220 = auVar55._12_4_;
      auVar202._12_4_ = auVar54._12_4_ * fVar220;
      auVar54 = vfmsub231ps_fma(auVar202,auVar50,auVar56);
      auVar56 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar54 = vshufps_avx(auVar57,auVar57,0xc9);
      auVar203._0_4_ = auVar54._0_4_ * fVar120;
      auVar203._4_4_ = auVar54._4_4_ * fVar210;
      auVar203._8_4_ = auVar54._8_4_ * fVar219;
      auVar203._12_4_ = auVar54._12_4_ * fVar220;
      auVar50 = vfmsub231ps_fma(auVar203,auVar50,auVar57);
      auVar57 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar50 = vdpps_avx(auVar3,auVar3,0x7f);
      fVar126 = auVar50._0_4_;
      auVar82._4_28_ = auVar83._4_28_;
      auVar82._0_4_ = fVar126;
      auVar54 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar82._0_16_);
      auVar58 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
      auVar53 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
      fVar127 = auVar54._0_4_;
      fVar128 = auVar58._0_4_ - auVar53._0_4_ * fVar127 * fVar127 * fVar127;
      auVar54 = vdpps_avx(auVar3,auVar59,0x7f);
      fVar234 = fVar128 * auVar3._0_4_;
      fVar240 = fVar128 * auVar3._4_4_;
      fVar241 = fVar128 * auVar3._8_4_;
      fVar242 = fVar128 * auVar3._12_4_;
      auVar193._0_4_ = fVar126 * auVar59._0_4_;
      auVar193._4_4_ = fVar126 * auVar59._4_4_;
      auVar193._8_4_ = fVar126 * auVar59._8_4_;
      auVar193._12_4_ = fVar126 * auVar59._12_4_;
      fVar126 = auVar54._0_4_;
      auVar75._0_4_ = fVar126 * auVar3._0_4_;
      auVar75._4_4_ = fVar126 * auVar3._4_4_;
      auVar75._8_4_ = fVar126 * auVar3._8_4_;
      auVar75._12_4_ = fVar126 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar193,auVar75);
      auVar54 = vrcp14ss_avx512f(auVar83._0_16_,auVar82._0_16_);
      auVar50 = vfnmadd213ss_avx512f(auVar50,auVar54,ZEXT416(0x40000000));
      fVar126 = auVar54._0_4_ * auVar50._0_4_;
      auVar50 = vdpps_avx(auVar56,auVar56,0x7f);
      fVar127 = auVar50._0_4_;
      auVar85._16_16_ = auVar83._16_16_;
      auVar85._0_16_ = auVar83._0_16_;
      auVar84._4_28_ = auVar85._4_28_;
      auVar84._0_4_ = fVar127;
      auVar54 = vrsqrt14ss_avx512f(auVar83._0_16_,auVar84._0_16_);
      auVar59 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
      auVar58 = vmulss_avx512f(auVar50,ZEXT416(0x3f000000));
      fVar142 = auVar54._0_4_;
      fVar142 = auVar59._0_4_ - auVar58._0_4_ * fVar142 * fVar142 * fVar142;
      auVar54 = vdpps_avx(auVar56,auVar57,0x7f);
      fVar221 = fVar142 * auVar56._0_4_;
      fVar231 = fVar142 * auVar56._4_4_;
      fVar232 = fVar142 * auVar56._8_4_;
      fVar233 = fVar142 * auVar56._12_4_;
      auVar69._0_4_ = fVar127 * auVar57._0_4_;
      auVar69._4_4_ = fVar127 * auVar57._4_4_;
      auVar69._8_4_ = fVar127 * auVar57._8_4_;
      auVar69._12_4_ = fVar127 * auVar57._12_4_;
      fVar127 = auVar54._0_4_;
      auVar68._0_4_ = fVar127 * auVar56._0_4_;
      auVar68._4_4_ = fVar127 * auVar56._4_4_;
      auVar68._8_4_ = fVar127 * auVar56._8_4_;
      auVar68._12_4_ = fVar127 * auVar56._12_4_;
      auVar59 = vsubps_avx(auVar69,auVar68);
      auVar54 = vrcp14ss_avx512f(auVar83._0_16_,auVar84._0_16_);
      auVar50 = vfnmadd213ss_avx512f(auVar50,auVar54,ZEXT416(0x40000000));
      fVar127 = auVar50._0_4_ * auVar54._0_4_;
      auVar50 = vshufps_avx(auVar61,auVar61,0xff);
      auVar179._0_4_ = fVar234 * auVar50._0_4_;
      auVar179._4_4_ = fVar240 * auVar50._4_4_;
      auVar179._8_4_ = fVar241 * auVar50._8_4_;
      auVar179._12_4_ = fVar242 * auVar50._12_4_;
      local_340 = vsubps_avx(auVar61,auVar179);
      auVar54 = vshufps_avx(auVar52,auVar52,0xff);
      auVar166._0_4_ = auVar54._0_4_ * fVar234 + auVar50._0_4_ * fVar128 * fVar126 * auVar3._0_4_;
      auVar166._4_4_ = auVar54._4_4_ * fVar240 + auVar50._4_4_ * fVar128 * fVar126 * auVar3._4_4_;
      auVar166._8_4_ = auVar54._8_4_ * fVar241 + auVar50._8_4_ * fVar128 * fVar126 * auVar3._8_4_;
      auVar166._12_4_ =
           auVar54._12_4_ * fVar242 + auVar50._12_4_ * fVar128 * fVar126 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar52,auVar166);
      local_350._0_4_ = auVar179._0_4_ + auVar61._0_4_;
      local_350._4_4_ = auVar179._4_4_ + auVar61._4_4_;
      fStack_348 = auVar179._8_4_ + auVar61._8_4_;
      fStack_344 = auVar179._12_4_ + auVar61._12_4_;
      auVar50 = vshufps_avx(auVar51,auVar51,0xff);
      auVar64._0_4_ = fVar221 * auVar50._0_4_;
      auVar64._4_4_ = fVar231 * auVar50._4_4_;
      auVar64._8_4_ = fVar232 * auVar50._8_4_;
      auVar64._12_4_ = fVar233 * auVar50._12_4_;
      local_360 = vsubps_avx512vl(auVar51,auVar64);
      auVar54 = vshufps_avx(auVar55,auVar55,0xff);
      auVar62._0_4_ = auVar54._0_4_ * fVar221 + auVar50._0_4_ * fVar142 * auVar59._0_4_ * fVar127;
      auVar62._4_4_ = auVar54._4_4_ * fVar231 + auVar50._4_4_ * fVar142 * auVar59._4_4_ * fVar127;
      auVar62._8_4_ = auVar54._8_4_ * fVar232 + auVar50._8_4_ * fVar142 * auVar59._8_4_ * fVar127;
      auVar62._12_4_ =
           auVar54._12_4_ * fVar233 + auVar50._12_4_ * fVar142 * auVar59._12_4_ * fVar127;
      auVar50 = vsubps_avx(auVar55,auVar62);
      _local_370 = vaddps_avx512vl(auVar51,auVar64);
      auVar72._0_4_ = auVar3._0_4_ * 0.33333334;
      auVar72._4_4_ = auVar3._4_4_ * 0.33333334;
      auVar72._8_4_ = auVar3._8_4_ * 0.33333334;
      auVar72._12_4_ = auVar3._12_4_ * 0.33333334;
      local_380 = vaddps_avx512vl(local_340,auVar72);
      auVar66._0_4_ = auVar50._0_4_ * 0.33333334;
      auVar66._4_4_ = auVar50._4_4_ * 0.33333334;
      auVar66._8_4_ = auVar50._8_4_ * 0.33333334;
      auVar66._12_4_ = auVar50._12_4_ * 0.33333334;
      local_390 = vsubps_avx512vl(local_360,auVar66);
      auVar52._0_4_ = (fVar129 + auVar166._0_4_) * 0.33333334;
      auVar52._4_4_ = (fVar134 + auVar166._4_4_) * 0.33333334;
      auVar52._8_4_ = (fVar135 + auVar166._8_4_) * 0.33333334;
      auVar52._12_4_ = (fVar136 + auVar166._12_4_) * 0.33333334;
      _local_3a0 = vaddps_avx512vl(_local_350,auVar52);
      auVar53._0_4_ = (fVar120 + auVar62._0_4_) * 0.33333334;
      auVar53._4_4_ = (fVar210 + auVar62._4_4_) * 0.33333334;
      auVar53._8_4_ = (fVar219 + auVar62._8_4_) * 0.33333334;
      auVar53._12_4_ = (fVar220 + auVar62._12_4_) * 0.33333334;
      _local_3b0 = vsubps_avx512vl(_local_370,auVar53);
      local_2c0 = vsubps_avx(local_340,auVar60);
      uVar130 = local_2c0._0_4_;
      auVar63._4_4_ = uVar130;
      auVar63._0_4_ = uVar130;
      auVar63._8_4_ = uVar130;
      auVar63._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_2c0,local_2c0,0x55);
      auVar54 = vshufps_avx(local_2c0,local_2c0,0xaa);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      fVar120 = pre->ray_space[k].vz.field_0.m128[0];
      fVar210 = pre->ray_space[k].vz.field_0.m128[1];
      fVar219 = pre->ray_space[k].vz.field_0.m128[2];
      fVar220 = pre->ray_space[k].vz.field_0.m128[3];
      auVar131._0_4_ = fVar120 * auVar54._0_4_;
      auVar131._4_4_ = fVar210 * auVar54._4_4_;
      auVar131._8_4_ = fVar219 * auVar54._8_4_;
      auVar131._12_4_ = fVar220 * auVar54._12_4_;
      auVar50 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar2,auVar50);
      auVar56 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar63);
      local_2d0 = vsubps_avx512vl(local_380,auVar60);
      uVar130 = local_2d0._0_4_;
      auVar67._4_4_ = uVar130;
      auVar67._0_4_ = uVar130;
      auVar67._8_4_ = uVar130;
      auVar67._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_2d0,local_2d0,0x55);
      auVar54 = vshufps_avx(local_2d0,local_2d0,0xaa);
      auVar71._0_4_ = fVar120 * auVar54._0_4_;
      auVar71._4_4_ = fVar210 * auVar54._4_4_;
      auVar71._8_4_ = fVar219 * auVar54._8_4_;
      auVar71._12_4_ = fVar220 * auVar54._12_4_;
      auVar50 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar50);
      auVar57 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar67);
      local_2e0 = vsubps_avx512vl(local_390,auVar60);
      uVar130 = local_2e0._0_4_;
      auVar65._4_4_ = uVar130;
      auVar65._0_4_ = uVar130;
      auVar65._8_4_ = uVar130;
      auVar65._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_2e0,local_2e0,0x55);
      auVar54 = vshufps_avx(local_2e0,local_2e0,0xaa);
      auVar70._0_4_ = fVar120 * auVar54._0_4_;
      auVar70._4_4_ = fVar210 * auVar54._4_4_;
      auVar70._8_4_ = fVar219 * auVar54._8_4_;
      auVar70._12_4_ = fVar220 * auVar54._12_4_;
      auVar50 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar2,auVar50);
      auVar51 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar65);
      local_2f0 = vsubps_avx512vl(local_360,auVar60);
      uVar130 = local_2f0._0_4_;
      auVar180._4_4_ = uVar130;
      auVar180._0_4_ = uVar130;
      auVar180._8_4_ = uVar130;
      auVar180._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_2f0,local_2f0,0x55);
      auVar54 = vshufps_avx(local_2f0,local_2f0,0xaa);
      auVar73._0_4_ = fVar120 * auVar54._0_4_;
      auVar73._4_4_ = fVar210 * auVar54._4_4_;
      auVar73._8_4_ = fVar219 * auVar54._8_4_;
      auVar73._12_4_ = fVar220 * auVar54._12_4_;
      auVar50 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar2,auVar50);
      auVar55 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar180);
      local_300 = vsubps_avx(_local_350,auVar60);
      uVar130 = local_300._0_4_;
      auVar181._4_4_ = uVar130;
      auVar181._0_4_ = uVar130;
      auVar181._8_4_ = uVar130;
      auVar181._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_300,local_300,0x55);
      auVar54 = vshufps_avx(local_300,local_300,0xaa);
      auVar204._0_4_ = auVar54._0_4_ * fVar120;
      auVar204._4_4_ = auVar54._4_4_ * fVar210;
      auVar204._8_4_ = auVar54._8_4_ * fVar219;
      auVar204._12_4_ = auVar54._12_4_ * fVar220;
      auVar50 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar50);
      auVar52 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar181);
      local_310 = vsubps_avx512vl(_local_3a0,auVar60);
      uVar130 = local_310._0_4_;
      auVar182._4_4_ = uVar130;
      auVar182._0_4_ = uVar130;
      auVar182._8_4_ = uVar130;
      auVar182._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_310,local_310,0x55);
      auVar54 = vshufps_avx(local_310,local_310,0xaa);
      auVar211._0_4_ = auVar54._0_4_ * fVar120;
      auVar211._4_4_ = auVar54._4_4_ * fVar210;
      auVar211._8_4_ = auVar54._8_4_ * fVar219;
      auVar211._12_4_ = auVar54._12_4_ * fVar220;
      auVar50 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar50);
      auVar53 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar182);
      local_320 = vsubps_avx(_local_3b0,auVar60);
      uVar130 = local_320._0_4_;
      auVar183._4_4_ = uVar130;
      auVar183._0_4_ = uVar130;
      auVar183._8_4_ = uVar130;
      auVar183._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_320,local_320,0x55);
      auVar54 = vshufps_avx(local_320,local_320,0xaa);
      auVar222._0_4_ = auVar54._0_4_ * fVar120;
      auVar222._4_4_ = auVar54._4_4_ * fVar210;
      auVar222._8_4_ = auVar54._8_4_ * fVar219;
      auVar222._12_4_ = auVar54._12_4_ * fVar220;
      auVar50 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar2,auVar50);
      auVar131 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar183);
      local_330 = vsubps_avx512vl(_local_370,auVar60);
      uVar130 = local_330._0_4_;
      auVar121._4_4_ = uVar130;
      auVar121._0_4_ = uVar130;
      auVar121._8_4_ = uVar130;
      auVar121._12_4_ = uVar130;
      auVar50 = vshufps_avx(local_330,local_330,0x55);
      auVar54 = vshufps_avx(local_330,local_330,0xaa);
      auVar173._0_4_ = auVar54._0_4_ * fVar120;
      auVar173._4_4_ = auVar54._4_4_ * fVar210;
      auVar173._8_4_ = auVar54._8_4_ * fVar219;
      auVar173._12_4_ = auVar54._12_4_ * fVar220;
      auVar50 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar2,auVar50);
      auVar121 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar1,auVar121);
      auVar3 = vmovlhps_avx(auVar56,auVar52);
      auVar59 = vmovlhps_avx(auVar57,auVar53);
      local_440 = vmovlhps_avx512f(auVar51,auVar131);
      _local_290 = vmovlhps_avx512f(auVar55,auVar121);
      auVar54 = vminps_avx(auVar3,auVar59);
      auVar50 = vmaxps_avx(auVar3,auVar59);
      auVar60 = vminps_avx512vl(local_440,_local_290);
      auVar54 = vminps_avx(auVar54,auVar60);
      auVar60 = vmaxps_avx512vl(local_440,_local_290);
      auVar50 = vmaxps_avx(auVar50,auVar60);
      auVar60 = vshufpd_avx(auVar54,auVar54,3);
      auVar54 = vminps_avx(auVar54,auVar60);
      auVar60 = vshufpd_avx(auVar50,auVar50,3);
      auVar50 = vmaxps_avx(auVar50,auVar60);
      auVar54 = vandps_avx512vl(auVar54,auVar256._0_16_);
      auVar50 = vandps_avx512vl(auVar50,auVar256._0_16_);
      auVar50 = vmaxps_avx(auVar54,auVar50);
      auVar54 = vmovshdup_avx(auVar50);
      auVar50 = vmaxss_avx(auVar54,auVar50);
      local_478 = (uint)uVar44 + 0xff;
      auVar60 = vmovddup_avx512vl(auVar56);
      auVar56 = vmovddup_avx512vl(auVar57);
      auVar57 = vmovddup_avx512vl(auVar51);
      auVar132._8_8_ = auVar55._0_8_;
      auVar132._0_8_ = auVar55._0_8_;
      local_2a0 = ZEXT416((uint)(auVar50._0_4_ * 9.536743e-07));
      local_260 = vbroadcastss_avx512vl(local_2a0);
      auVar50 = vxorps_avx512vl(local_260._0_16_,auVar257._0_16_);
      local_280 = vbroadcastss_avx512vl(auVar50);
      uVar38 = 0;
      auVar50 = vsubps_avx(auVar59,auVar3);
      auVar101._0_16_ = vsubps_avx512vl(local_440,auVar59);
      local_2b0 = vsubps_avx512vl(_local_290,local_440);
      local_3c0 = vsubps_avx(_local_350,local_340);
      local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
      local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
      _local_3f0 = vsubps_avx512vl(_local_370,local_360);
      local_1e0 = vpbroadcastd_avx512vl();
      local_200 = vpbroadcastd_avx512vl();
      auVar54 = ZEXT816(0x3f80000000000000);
      auVar58 = auVar54;
LAB_01d01817:
      auVar51 = vshufps_avx(auVar58,auVar58,0x50);
      auVar243._8_4_ = 0x3f800000;
      auVar243._0_8_ = 0x3f8000003f800000;
      auVar243._12_4_ = 0x3f800000;
      auVar246._16_4_ = 0x3f800000;
      auVar246._0_16_ = auVar243;
      auVar246._20_4_ = 0x3f800000;
      auVar246._24_4_ = 0x3f800000;
      auVar246._28_4_ = 0x3f800000;
      auVar55 = vsubps_avx(auVar243,auVar51);
      fVar120 = auVar51._0_4_;
      fVar126 = auVar52._0_4_;
      auVar151._0_4_ = fVar126 * fVar120;
      fVar210 = auVar51._4_4_;
      fVar127 = auVar52._4_4_;
      auVar151._4_4_ = fVar127 * fVar210;
      fVar219 = auVar51._8_4_;
      auVar151._8_4_ = fVar126 * fVar219;
      fVar220 = auVar51._12_4_;
      auVar151._12_4_ = fVar127 * fVar220;
      fVar128 = auVar53._0_4_;
      auVar157._0_4_ = fVar128 * fVar120;
      fVar142 = auVar53._4_4_;
      auVar157._4_4_ = fVar142 * fVar210;
      auVar157._8_4_ = fVar128 * fVar219;
      auVar157._12_4_ = fVar142 * fVar220;
      fVar129 = auVar131._0_4_;
      auVar167._0_4_ = fVar129 * fVar120;
      fVar134 = auVar131._4_4_;
      auVar167._4_4_ = fVar134 * fVar210;
      auVar167._8_4_ = fVar129 * fVar219;
      auVar167._12_4_ = fVar134 * fVar220;
      fVar135 = auVar121._0_4_;
      auVar137._0_4_ = fVar135 * fVar120;
      fVar136 = auVar121._4_4_;
      auVar137._4_4_ = fVar136 * fVar210;
      auVar137._8_4_ = fVar135 * fVar219;
      auVar137._12_4_ = fVar136 * fVar220;
      auVar61 = vfmadd231ps_avx512vl(auVar151,auVar55,auVar60);
      auVar62 = vfmadd231ps_avx512vl(auVar157,auVar55,auVar56);
      auVar63 = vfmadd231ps_avx512vl(auVar167,auVar55,auVar57);
      auVar55 = vfmadd231ps_fma(auVar137,auVar132,auVar55);
      auVar51 = vmovshdup_avx(auVar54);
      fVar210 = auVar54._0_4_;
      fVar120 = (auVar51._0_4_ - fVar210) * 0.04761905;
      auVar191._4_4_ = fVar210;
      auVar191._0_4_ = fVar210;
      auVar191._8_4_ = fVar210;
      auVar191._12_4_ = fVar210;
      auVar191._16_4_ = fVar210;
      auVar191._20_4_ = fVar210;
      auVar191._24_4_ = fVar210;
      auVar191._28_4_ = fVar210;
      auVar149._0_8_ = auVar51._0_8_;
      auVar149._8_8_ = auVar149._0_8_;
      auVar149._16_8_ = auVar149._0_8_;
      auVar149._24_8_ = auVar149._0_8_;
      auVar81 = vsubps_avx(auVar149,auVar191);
      uVar130 = auVar61._0_4_;
      auVar150._4_4_ = uVar130;
      auVar150._0_4_ = uVar130;
      auVar150._8_4_ = uVar130;
      auVar150._12_4_ = uVar130;
      auVar150._16_4_ = uVar130;
      auVar150._20_4_ = uVar130;
      auVar150._24_4_ = uVar130;
      auVar150._28_4_ = uVar130;
      auVar207._8_4_ = 1;
      auVar207._0_8_ = 0x100000001;
      auVar207._12_4_ = 1;
      auVar207._16_4_ = 1;
      auVar207._20_4_ = 1;
      auVar207._24_4_ = 1;
      auVar207._28_4_ = 1;
      auVar96 = ZEXT1632(auVar61);
      auVar79 = vpermps_avx2(auVar207,auVar96);
      auVar86 = vbroadcastss_avx512vl(auVar62);
      auVar97 = ZEXT1632(auVar62);
      auVar80 = vpermps_avx512vl(auVar207,auVar97);
      auVar87 = vbroadcastss_avx512vl(auVar63);
      auVar77 = ZEXT1632(auVar63);
      auVar88 = vpermps_avx512vl(auVar207,auVar77);
      auVar89 = vbroadcastss_avx512vl(auVar55);
      auVar93 = ZEXT1632(auVar55);
      auVar90 = vpermps_avx512vl(auVar207,auVar93);
      auVar208._4_4_ = fVar120;
      auVar208._0_4_ = fVar120;
      auVar208._8_4_ = fVar120;
      auVar208._12_4_ = fVar120;
      auVar208._16_4_ = fVar120;
      auVar208._20_4_ = fVar120;
      auVar208._24_4_ = fVar120;
      auVar208._28_4_ = fVar120;
      auVar94 = auVar261._0_32_;
      auVar78 = vpermps_avx512vl(auVar94,auVar96);
      auVar178._8_4_ = 3;
      auVar178._0_8_ = 0x300000003;
      auVar178._12_4_ = 3;
      auVar178._16_4_ = 3;
      auVar178._20_4_ = 3;
      auVar178._24_4_ = 3;
      auVar178._28_4_ = 3;
      auVar91 = vpermps_avx512vl(auVar178,auVar96);
      auVar92 = vpermps_avx512vl(auVar94,auVar97);
      auVar96 = vpermps_avx2(auVar178,auVar97);
      auVar76 = vpermps_avx512vl(auVar94,auVar77);
      auVar97 = vpermps_avx2(auVar178,auVar77);
      auVar77 = vpermps_avx512vl(auVar94,auVar93);
      auVar93 = vpermps_avx512vl(auVar178,auVar93);
      auVar51 = vfmadd132ps_fma(auVar81,auVar191,_DAT_01faff20);
      auVar81 = vsubps_avx(auVar246,ZEXT1632(auVar51));
      auVar94 = vmulps_avx512vl(auVar86,ZEXT1632(auVar51));
      auVar98 = ZEXT1632(auVar51);
      auVar95 = vmulps_avx512vl(auVar80,auVar98);
      auVar55 = vfmadd231ps_fma(auVar94,auVar81,auVar150);
      auVar61 = vfmadd231ps_fma(auVar95,auVar81,auVar79);
      auVar94 = vmulps_avx512vl(auVar87,auVar98);
      auVar95 = vmulps_avx512vl(auVar88,auVar98);
      auVar86 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar86);
      auVar80 = vfmadd231ps_avx512vl(auVar95,auVar81,auVar80);
      auVar94 = vmulps_avx512vl(auVar89,auVar98);
      auVar95 = ZEXT1632(auVar51);
      auVar90 = vmulps_avx512vl(auVar90,auVar95);
      auVar87 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar87);
      auVar88 = vfmadd231ps_avx512vl(auVar90,auVar81,auVar88);
      fVar219 = auVar51._0_4_;
      fVar220 = auVar51._4_4_;
      auVar19._4_4_ = fVar220 * auVar86._4_4_;
      auVar19._0_4_ = fVar219 * auVar86._0_4_;
      fVar221 = auVar51._8_4_;
      auVar19._8_4_ = fVar221 * auVar86._8_4_;
      fVar231 = auVar51._12_4_;
      auVar19._12_4_ = fVar231 * auVar86._12_4_;
      auVar19._16_4_ = auVar86._16_4_ * 0.0;
      auVar19._20_4_ = auVar86._20_4_ * 0.0;
      auVar19._24_4_ = auVar86._24_4_ * 0.0;
      auVar19._28_4_ = fVar210;
      auVar20._4_4_ = fVar220 * auVar80._4_4_;
      auVar20._0_4_ = fVar219 * auVar80._0_4_;
      auVar20._8_4_ = fVar221 * auVar80._8_4_;
      auVar20._12_4_ = fVar231 * auVar80._12_4_;
      auVar20._16_4_ = auVar80._16_4_ * 0.0;
      auVar20._20_4_ = auVar80._20_4_ * 0.0;
      auVar20._24_4_ = auVar80._24_4_ * 0.0;
      auVar20._28_4_ = auVar79._28_4_;
      auVar55 = vfmadd231ps_fma(auVar19,auVar81,ZEXT1632(auVar55));
      auVar61 = vfmadd231ps_fma(auVar20,auVar81,ZEXT1632(auVar61));
      auVar140._0_4_ = fVar219 * auVar87._0_4_;
      auVar140._4_4_ = fVar220 * auVar87._4_4_;
      auVar140._8_4_ = fVar221 * auVar87._8_4_;
      auVar140._12_4_ = fVar231 * auVar87._12_4_;
      auVar140._16_4_ = auVar87._16_4_ * 0.0;
      auVar140._20_4_ = auVar87._20_4_ * 0.0;
      auVar140._24_4_ = auVar87._24_4_ * 0.0;
      auVar140._28_4_ = 0;
      auVar21._4_4_ = fVar220 * auVar88._4_4_;
      auVar21._0_4_ = fVar219 * auVar88._0_4_;
      auVar21._8_4_ = fVar221 * auVar88._8_4_;
      auVar21._12_4_ = fVar231 * auVar88._12_4_;
      auVar21._16_4_ = auVar88._16_4_ * 0.0;
      auVar21._20_4_ = auVar88._20_4_ * 0.0;
      auVar21._24_4_ = auVar88._24_4_ * 0.0;
      auVar21._28_4_ = auVar87._28_4_;
      auVar62 = vfmadd231ps_fma(auVar140,auVar81,auVar86);
      auVar63 = vfmadd231ps_fma(auVar21,auVar81,auVar80);
      auVar22._28_4_ = auVar80._28_4_;
      auVar22._0_28_ =
           ZEXT1628(CONCAT412(fVar231 * auVar63._12_4_,
                              CONCAT48(fVar221 * auVar63._8_4_,
                                       CONCAT44(fVar220 * auVar63._4_4_,fVar219 * auVar63._0_4_))));
      auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar231 * auVar62._12_4_,
                                                   CONCAT48(fVar221 * auVar62._8_4_,
                                                            CONCAT44(fVar220 * auVar62._4_4_,
                                                                     fVar219 * auVar62._0_4_)))),
                                auVar81,ZEXT1632(auVar55));
      auVar72 = vfmadd231ps_fma(auVar22,auVar81,ZEXT1632(auVar61));
      auVar79 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar55));
      auVar86 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61));
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar79 = vmulps_avx512vl(auVar79,auVar80);
      auVar86 = vmulps_avx512vl(auVar86,auVar80);
      auVar201._0_4_ = fVar120 * auVar79._0_4_;
      auVar201._4_4_ = fVar120 * auVar79._4_4_;
      auVar201._8_4_ = fVar120 * auVar79._8_4_;
      auVar201._12_4_ = fVar120 * auVar79._12_4_;
      auVar201._16_4_ = fVar120 * auVar79._16_4_;
      auVar201._20_4_ = fVar120 * auVar79._20_4_;
      auVar201._24_4_ = fVar120 * auVar79._24_4_;
      auVar201._28_4_ = 0;
      auVar79 = vmulps_avx512vl(auVar208,auVar86);
      auVar61 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
      auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01feed00,ZEXT1632(auVar61));
      auVar87 = vpermt2ps_avx512vl(ZEXT1632(auVar72),_DAT_01feed00,ZEXT1632(auVar61));
      auVar141._0_4_ = auVar201._0_4_ + auVar71._0_4_;
      auVar141._4_4_ = auVar201._4_4_ + auVar71._4_4_;
      auVar141._8_4_ = auVar201._8_4_ + auVar71._8_4_;
      auVar141._12_4_ = auVar201._12_4_ + auVar71._12_4_;
      auVar141._16_4_ = auVar201._16_4_ + 0.0;
      auVar141._20_4_ = auVar201._20_4_ + 0.0;
      auVar141._24_4_ = auVar201._24_4_ + 0.0;
      auVar141._28_4_ = 0;
      auVar98 = ZEXT1632(auVar61);
      auVar88 = vpermt2ps_avx512vl(auVar201,_DAT_01feed00,auVar98);
      auVar89 = vaddps_avx512vl(ZEXT1632(auVar72),auVar79);
      auVar90 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar98);
      auVar79 = vsubps_avx(auVar86,auVar88);
      auVar88 = vsubps_avx512vl(auVar87,auVar90);
      auVar90 = vmulps_avx512vl(auVar92,auVar95);
      auVar94 = vmulps_avx512vl(auVar96,auVar95);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar81,auVar78);
      auVar78 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar91);
      auVar91 = vmulps_avx512vl(auVar76,auVar95);
      auVar94 = vmulps_avx512vl(auVar97,auVar95);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar81,auVar92);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar81,auVar96);
      auVar92 = vmulps_avx512vl(auVar77,auVar95);
      auVar77 = vmulps_avx512vl(auVar93,auVar95);
      auVar55 = vfmadd231ps_fma(auVar92,auVar81,auVar76);
      auVar92 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar97);
      auVar76 = vmulps_avx512vl(auVar95,auVar91);
      auVar93 = ZEXT1632(auVar51);
      auVar77 = vmulps_avx512vl(auVar93,auVar96);
      auVar90 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar90);
      auVar78 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar78);
      auVar92 = vmulps_avx512vl(auVar93,auVar92);
      auVar91 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar231 * auVar55._12_4_,
                                              CONCAT48(fVar221 * auVar55._8_4_,
                                                       CONCAT44(fVar220 * auVar55._4_4_,
                                                                fVar219 * auVar55._0_4_)))),auVar81,
                           auVar91);
      auVar96 = vfmadd231ps_avx512vl(auVar92,auVar81,auVar96);
      auVar23._4_4_ = fVar220 * auVar91._4_4_;
      auVar23._0_4_ = fVar219 * auVar91._0_4_;
      auVar23._8_4_ = fVar221 * auVar91._8_4_;
      auVar23._12_4_ = fVar231 * auVar91._12_4_;
      auVar23._16_4_ = auVar91._16_4_ * 0.0;
      auVar23._20_4_ = auVar91._20_4_ * 0.0;
      auVar23._24_4_ = auVar91._24_4_ * 0.0;
      auVar23._28_4_ = auVar97._28_4_;
      auVar97 = vmulps_avx512vl(auVar93,auVar96);
      auVar92 = vfmadd231ps_avx512vl(auVar23,auVar81,auVar90);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar78,auVar81);
      auVar81 = vsubps_avx512vl(auVar91,auVar90);
      auVar96 = vsubps_avx512vl(auVar96,auVar78);
      auVar81 = vmulps_avx512vl(auVar81,auVar80);
      auVar96 = vmulps_avx512vl(auVar96,auVar80);
      fVar210 = fVar120 * auVar81._0_4_;
      fVar219 = fVar120 * auVar81._4_4_;
      auVar24._4_4_ = fVar219;
      auVar24._0_4_ = fVar210;
      fVar220 = fVar120 * auVar81._8_4_;
      auVar24._8_4_ = fVar220;
      fVar221 = fVar120 * auVar81._12_4_;
      auVar24._12_4_ = fVar221;
      fVar231 = fVar120 * auVar81._16_4_;
      auVar24._16_4_ = fVar231;
      fVar232 = fVar120 * auVar81._20_4_;
      auVar24._20_4_ = fVar232;
      fVar120 = fVar120 * auVar81._24_4_;
      auVar24._24_4_ = fVar120;
      auVar24._28_4_ = auVar81._28_4_;
      auVar96 = vmulps_avx512vl(auVar208,auVar96);
      auVar80 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,auVar98);
      auVar90 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar98);
      auVar209._0_4_ = auVar92._0_4_ + fVar210;
      auVar209._4_4_ = auVar92._4_4_ + fVar219;
      auVar209._8_4_ = auVar92._8_4_ + fVar220;
      auVar209._12_4_ = auVar92._12_4_ + fVar221;
      auVar209._16_4_ = auVar92._16_4_ + fVar231;
      auVar209._20_4_ = auVar92._20_4_ + fVar232;
      auVar209._24_4_ = auVar92._24_4_ + fVar120;
      auVar209._28_4_ = auVar92._28_4_ + auVar81._28_4_;
      auVar81 = vpermt2ps_avx512vl(auVar24,_DAT_01feed00,ZEXT1632(auVar61));
      auVar78 = vaddps_avx512vl(auVar97,auVar96);
      in_ZMM16 = ZEXT3264(auVar78);
      auVar96 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,ZEXT1632(auVar61));
      auVar81 = vsubps_avx(auVar80,auVar81);
      auVar96 = vsubps_avx512vl(auVar90,auVar96);
      auVar154 = ZEXT1632(auVar71);
      auVar91 = vsubps_avx512vl(auVar92,auVar154);
      auVar163 = ZEXT1632(auVar72);
      auVar76 = vsubps_avx512vl(auVar97,auVar163);
      auVar77 = vsubps_avx512vl(auVar80,auVar86);
      auVar91 = vaddps_avx512vl(auVar91,auVar77);
      auVar77 = vsubps_avx512vl(auVar90,auVar87);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar163,auVar91);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar154,auVar76);
      auVar93 = vmulps_avx512vl(auVar89,auVar91);
      auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar141,auVar76);
      auVar94 = vmulps_avx512vl(auVar88,auVar91);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar79,auVar76);
      auVar95 = vmulps_avx512vl(auVar87,auVar91);
      auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar86,auVar76);
      auVar98 = vmulps_avx512vl(auVar97,auVar91);
      auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar92,auVar76);
      auVar99 = vmulps_avx512vl(auVar78,auVar91);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar209,auVar76);
      auVar100 = vmulps_avx512vl(auVar96,auVar91);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar81,auVar76);
      auVar91 = vmulps_avx512vl(auVar90,auVar91);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar80,auVar76);
      auVar76 = vminps_avx512vl(auVar77,auVar93);
      auVar77 = vmaxps_avx512vl(auVar77,auVar93);
      auVar93 = vminps_avx512vl(auVar94,auVar95);
      auVar76 = vminps_avx512vl(auVar76,auVar93);
      auVar93 = vmaxps_avx512vl(auVar94,auVar95);
      auVar77 = vmaxps_avx512vl(auVar77,auVar93);
      auVar93 = vminps_avx512vl(auVar98,auVar99);
      auVar94 = vmaxps_avx512vl(auVar98,auVar99);
      auVar95 = vminps_avx512vl(auVar100,auVar91);
      auVar93 = vminps_avx512vl(auVar93,auVar95);
      auVar76 = vminps_avx512vl(auVar76,auVar93);
      auVar91 = vmaxps_avx512vl(auVar100,auVar91);
      auVar91 = vmaxps_avx512vl(auVar94,auVar91);
      auVar91 = vmaxps_avx512vl(auVar77,auVar91);
      uVar13 = vcmpps_avx512vl(auVar76,local_260,2);
      uVar14 = vcmpps_avx512vl(auVar91,local_280,5);
      bVar36 = (byte)uVar13 & (byte)uVar14 & 0x7f;
      if (bVar36 != 0) {
        auVar91 = vsubps_avx512vl(auVar86,auVar154);
        auVar76 = vsubps_avx512vl(auVar87,auVar163);
        auVar77 = vsubps_avx512vl(auVar80,auVar92);
        auVar91 = vaddps_avx512vl(auVar91,auVar77);
        auVar77 = vsubps_avx512vl(auVar90,auVar97);
        auVar76 = vaddps_avx512vl(auVar76,auVar77);
        auVar77 = vmulps_avx512vl(auVar163,auVar91);
        auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar154);
        auVar89 = vmulps_avx512vl(auVar89,auVar91);
        auVar89 = vfnmadd213ps_avx512vl(auVar141,auVar76,auVar89);
        auVar88 = vmulps_avx512vl(auVar88,auVar91);
        auVar88 = vfnmadd213ps_avx512vl(auVar79,auVar76,auVar88);
        auVar79 = vmulps_avx512vl(auVar87,auVar91);
        auVar87 = vfnmadd231ps_avx512vl(auVar79,auVar76,auVar86);
        auVar79 = vmulps_avx512vl(auVar97,auVar91);
        auVar97 = vfnmadd231ps_avx512vl(auVar79,auVar76,auVar92);
        auVar79 = vmulps_avx512vl(auVar78,auVar91);
        auVar78 = vfnmadd213ps_avx512vl(auVar209,auVar76,auVar79);
        auVar79 = vmulps_avx512vl(auVar96,auVar91);
        auVar92 = vfnmadd213ps_avx512vl(auVar81,auVar76,auVar79);
        auVar81 = vmulps_avx512vl(auVar90,auVar91);
        auVar80 = vfnmadd231ps_avx512vl(auVar81,auVar80,auVar76);
        auVar79 = vminps_avx(auVar77,auVar89);
        auVar81 = vmaxps_avx(auVar77,auVar89);
        auVar86 = vminps_avx(auVar88,auVar87);
        auVar86 = vminps_avx(auVar79,auVar86);
        auVar79 = vmaxps_avx(auVar88,auVar87);
        auVar81 = vmaxps_avx(auVar81,auVar79);
        auVar96 = vminps_avx(auVar97,auVar78);
        auVar79 = vmaxps_avx(auVar97,auVar78);
        auVar97 = vminps_avx(auVar92,auVar80);
        auVar96 = vminps_avx(auVar96,auVar97);
        auVar96 = vminps_avx(auVar86,auVar96);
        auVar86 = vmaxps_avx(auVar92,auVar80);
        auVar79 = vmaxps_avx(auVar79,auVar86);
        auVar81 = vmaxps_avx(auVar81,auVar79);
        uVar13 = vcmpps_avx512vl(auVar81,local_280,5);
        uVar14 = vcmpps_avx512vl(auVar96,local_260,2);
        bVar36 = bVar36 & (byte)uVar13 & (byte)uVar14;
        if (bVar36 != 0) {
          auStack_430[uVar38] = (uint)bVar36;
          uVar13 = vmovlps_avx(auVar54);
          (&uStack_240)[uVar38] = uVar13;
          uVar42 = vmovlps_avx(auVar58);
          auStack_1a0[uVar38] = uVar42;
          uVar38 = (ulong)((int)uVar38 + 1);
        }
      }
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar254 = ZEXT1664(auVar54);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar256 = ZEXT1664(auVar54);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar257 = ZEXT1664(auVar54);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar255 = ZEXT3264(auVar81);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar258 = ZEXT1664(auVar54);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar259 = ZEXT1664(auVar54);
      auVar260 = ZEXT3264(_DAT_01feed20);
      auVar101._16_16_ = DAT_01feed20._16_16_;
      auVar114 = auVar101;
      if ((int)uVar38 != 0) {
        do {
          uVar37 = (int)uVar38 - 1;
          uVar39 = (ulong)uVar37;
          uVar119 = auStack_430[uVar39];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = auStack_1a0[uVar39];
          uVar42 = 0;
          for (uVar43 = (ulong)uVar119; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000
              ) {
            uVar42 = uVar42 + 1;
          }
          uVar41 = uVar119 - 1 & uVar119;
          bVar48 = uVar41 == 0;
          auStack_430[uVar39] = uVar41;
          if (bVar48) {
            uVar38 = (ulong)uVar37;
          }
          auVar122._8_8_ = 0;
          auVar122._0_8_ = uVar42;
          auVar54 = vpunpcklqdq_avx(auVar122,ZEXT416((int)uVar42 + 1));
          auVar54 = vcvtqq2ps_avx512vl(auVar54);
          auVar54 = vmulps_avx512vl(auVar54,auVar258._0_16_);
          uVar130 = *(undefined4 *)((long)&uStack_240 + uVar39 * 8 + 4);
          auVar15._4_4_ = uVar130;
          auVar15._0_4_ = uVar130;
          auVar15._8_4_ = uVar130;
          auVar15._12_4_ = uVar130;
          auVar51 = vmulps_avx512vl(auVar54,auVar15);
          auVar55 = auVar259._0_16_;
          auVar54 = vsubps_avx512vl(auVar55,auVar54);
          uVar130 = *(undefined4 *)(&uStack_240 + uVar39);
          auVar16._4_4_ = uVar130;
          auVar16._0_4_ = uVar130;
          auVar16._8_4_ = uVar130;
          auVar16._12_4_ = uVar130;
          auVar54 = vfmadd231ps_avx512vl(auVar51,auVar54,auVar16);
          auVar51 = vmovshdup_avx(auVar54);
          fVar120 = auVar51._0_4_ - auVar54._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar120));
          if (uVar119 == 0 || bVar48) goto LAB_01d01817;
          auVar51 = vshufps_avx(auVar58,auVar58,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar120));
          auVar63 = vsubps_avx512vl(auVar55,auVar51);
          fVar210 = auVar51._0_4_;
          auVar158._0_4_ = fVar210 * fVar126;
          fVar219 = auVar51._4_4_;
          auVar158._4_4_ = fVar219 * fVar127;
          fVar220 = auVar51._8_4_;
          auVar158._8_4_ = fVar220 * fVar126;
          fVar221 = auVar51._12_4_;
          auVar158._12_4_ = fVar221 * fVar127;
          auVar168._0_4_ = fVar210 * fVar128;
          auVar168._4_4_ = fVar219 * fVar142;
          auVar168._8_4_ = fVar220 * fVar128;
          auVar168._12_4_ = fVar221 * fVar142;
          auVar174._0_4_ = fVar210 * fVar129;
          auVar174._4_4_ = fVar219 * fVar134;
          auVar174._8_4_ = fVar220 * fVar129;
          auVar174._12_4_ = fVar221 * fVar134;
          auVar144._0_4_ = fVar210 * fVar135;
          auVar144._4_4_ = fVar219 * fVar136;
          auVar144._8_4_ = fVar220 * fVar135;
          auVar144._12_4_ = fVar221 * fVar136;
          auVar51 = vfmadd231ps_fma(auVar158,auVar63,auVar60);
          auVar61 = vfmadd231ps_fma(auVar168,auVar63,auVar56);
          auVar62 = vfmadd231ps_fma(auVar174,auVar63,auVar57);
          auVar63 = vfmadd231ps_fma(auVar144,auVar132,auVar63);
          auVar155._16_16_ = auVar51;
          auVar155._0_16_ = auVar51;
          auVar164._16_16_ = auVar61;
          auVar164._0_16_ = auVar61;
          auVar172._16_16_ = auVar62;
          auVar172._0_16_ = auVar62;
          auVar79 = vpermps_avx512vl(auVar260._0_32_,ZEXT1632(auVar54));
          auVar81 = vsubps_avx(auVar164,auVar155);
          auVar61 = vfmadd213ps_fma(auVar81,auVar79,auVar155);
          auVar81 = vsubps_avx(auVar172,auVar164);
          auVar71 = vfmadd213ps_fma(auVar81,auVar79,auVar164);
          auVar51 = vsubps_avx(auVar63,auVar62);
          auVar165._16_16_ = auVar51;
          auVar165._0_16_ = auVar51;
          auVar51 = vfmadd213ps_fma(auVar165,auVar79,auVar172);
          auVar81 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar61));
          auVar61 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar61));
          auVar81 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar71));
          auVar51 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar71));
          auVar81 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar61));
          auVar166 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar81,auVar79);
          auVar81 = vmulps_avx512vl(auVar81,auVar255._0_32_);
          auVar114._16_16_ = auVar81._16_16_;
          fVar210 = fVar120 * 0.33333334;
          auVar175._0_8_ =
               CONCAT44(auVar166._4_4_ + fVar210 * auVar81._4_4_,
                        auVar166._0_4_ + fVar210 * auVar81._0_4_);
          auVar175._8_4_ = auVar166._8_4_ + fVar210 * auVar81._8_4_;
          auVar175._12_4_ = auVar166._12_4_ + fVar210 * auVar81._12_4_;
          auVar159._0_4_ = fVar210 * auVar81._16_4_;
          auVar159._4_4_ = fVar210 * auVar81._20_4_;
          auVar159._8_4_ = fVar210 * auVar81._24_4_;
          auVar159._12_4_ = fVar210 * auVar81._28_4_;
          auVar70 = vsubps_avx((undefined1  [16])0x0,auVar159);
          auVar71 = vshufpd_avx(auVar166,auVar166,3);
          auVar72 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar51 = vsubps_avx(auVar71,auVar166);
          auVar61 = vsubps_avx(auVar72,(undefined1  [16])0x0);
          auVar194._0_4_ = auVar51._0_4_ + auVar61._0_4_;
          auVar194._4_4_ = auVar51._4_4_ + auVar61._4_4_;
          auVar194._8_4_ = auVar51._8_4_ + auVar61._8_4_;
          auVar194._12_4_ = auVar51._12_4_ + auVar61._12_4_;
          auVar51 = vshufps_avx(auVar166,auVar166,0xb1);
          auVar61 = vshufps_avx(auVar175,auVar175,0xb1);
          auVar62 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar63 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar244._4_4_ = auVar194._0_4_;
          auVar244._0_4_ = auVar194._0_4_;
          auVar244._8_4_ = auVar194._0_4_;
          auVar244._12_4_ = auVar194._0_4_;
          auVar66 = vshufps_avx(auVar194,auVar194,0x55);
          fVar210 = auVar66._0_4_;
          auVar205._0_4_ = auVar51._0_4_ * fVar210;
          fVar219 = auVar66._4_4_;
          auVar205._4_4_ = auVar51._4_4_ * fVar219;
          fVar220 = auVar66._8_4_;
          auVar205._8_4_ = auVar51._8_4_ * fVar220;
          fVar221 = auVar66._12_4_;
          auVar205._12_4_ = auVar51._12_4_ * fVar221;
          auVar212._0_4_ = auVar61._0_4_ * fVar210;
          auVar212._4_4_ = auVar61._4_4_ * fVar219;
          auVar212._8_4_ = auVar61._8_4_ * fVar220;
          auVar212._12_4_ = auVar61._12_4_ * fVar221;
          auVar223._0_4_ = auVar62._0_4_ * fVar210;
          auVar223._4_4_ = auVar62._4_4_ * fVar219;
          auVar223._8_4_ = auVar62._8_4_ * fVar220;
          auVar223._12_4_ = auVar62._12_4_ * fVar221;
          auVar195._0_4_ = auVar63._0_4_ * fVar210;
          auVar195._4_4_ = auVar63._4_4_ * fVar219;
          auVar195._8_4_ = auVar63._8_4_ * fVar220;
          auVar195._12_4_ = auVar63._12_4_ * fVar221;
          auVar51 = vfmadd231ps_fma(auVar205,auVar244,auVar166);
          auVar61 = vfmadd231ps_fma(auVar212,auVar244,auVar175);
          auVar68 = vfmadd231ps_fma(auVar223,auVar244,auVar70);
          auVar69 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar244);
          auVar66 = vshufpd_avx(auVar51,auVar51,1);
          auVar67 = vshufpd_avx(auVar61,auVar61,1);
          auVar64 = vshufpd_avx512vl(auVar68,auVar68,1);
          auVar65 = vshufpd_avx512vl(auVar69,auVar69,1);
          auVar62 = vminss_avx(auVar51,auVar61);
          auVar51 = vmaxss_avx(auVar61,auVar51);
          auVar63 = vminss_avx(auVar68,auVar69);
          auVar61 = vmaxss_avx(auVar69,auVar68);
          auVar62 = vminss_avx(auVar62,auVar63);
          auVar51 = vmaxss_avx(auVar61,auVar51);
          auVar63 = vminss_avx(auVar66,auVar67);
          auVar61 = vmaxss_avx(auVar67,auVar66);
          auVar66 = vminss_avx512f(auVar64,auVar65);
          auVar67 = vmaxss_avx512f(auVar65,auVar64);
          auVar61 = vmaxss_avx(auVar67,auVar61);
          auVar114._0_16_ = vminss_avx512f(auVar63,auVar66);
          in_ZMM16 = ZEXT1664(auVar114._0_16_);
          fVar219 = auVar61._0_4_;
          fVar210 = auVar51._0_4_;
          if (0.0001 <= auVar62._0_4_) {
LAB_01d01f4a:
            vucomiss_avx512f(auVar114._0_16_);
            bVar49 = fVar219 <= -0.0001;
            bVar47 = -0.0001 < fVar210;
            bVar46 = bVar49;
            if (!bVar49) goto LAB_01d01fa0;
            uVar13 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar14 = vcmpps_avx512vl(auVar114._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar37 = (uint)uVar13 & (uint)uVar14;
            bVar10 = (uVar37 & 1) == 0;
            bVar49 = bVar47 && bVar10;
            bVar46 = bVar47 && (uVar37 & 1) == 0;
            if (bVar47 && bVar10) goto LAB_01d01fa0;
          }
          else {
            bVar49 = fVar219 == -0.0001;
            bVar46 = NAN(fVar219);
            if (fVar219 <= -0.0001) goto LAB_01d01f4a;
LAB_01d01fa0:
            auVar67 = auVar262._0_16_;
            vcmpss_avx512f(auVar62,auVar67,1);
            uVar13 = vcmpss_avx512f(auVar51,auVar67,1);
            bVar47 = (bool)((byte)uVar13 & 1);
            auVar103._16_16_ = auVar114._16_16_;
            auVar103._0_16_ = auVar263._0_16_;
            auVar102._4_28_ = auVar103._4_28_;
            auVar102._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * auVar263._0_4_);
            vucomiss_avx512f(auVar102._0_16_);
            bVar46 = (bool)(!bVar49 | bVar46);
            bVar47 = bVar46 == false;
            auVar105._16_16_ = auVar114._16_16_;
            auVar105._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar104._4_28_ = auVar105._4_28_;
            auVar104._0_4_ = (uint)bVar46 * auVar262._0_4_ + (uint)!bVar46 * 0x7f800000;
            auVar66 = auVar104._0_16_;
            auVar107._16_16_ = auVar114._16_16_;
            auVar107._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar106._4_28_ = auVar107._4_28_;
            auVar106._0_4_ = (uint)bVar46 * auVar262._0_4_ + (uint)!bVar46 * -0x800000;
            auVar63 = auVar106._0_16_;
            uVar13 = vcmpss_avx512f(auVar114._0_16_,auVar67,1);
            bVar49 = (bool)((byte)uVar13 & 1);
            auVar109._16_16_ = auVar114._16_16_;
            auVar109._0_16_ = auVar263._0_16_;
            auVar108._4_28_ = auVar109._4_28_;
            auVar108._0_4_ = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * auVar263._0_4_);
            vucomiss_avx512f(auVar108._0_16_);
            if ((bVar46) || (bVar47)) {
              auVar68 = vucomiss_avx512f(auVar62);
              if ((bVar46) || (bVar47)) {
                auVar69 = vxorps_avx512vl(auVar62,auVar257._0_16_);
                auVar62 = vsubss_avx512f(auVar68,auVar62);
                auVar62 = vdivss_avx512f(auVar69,auVar62);
                auVar68 = vsubss_avx512f(ZEXT416(0x3f800000),auVar62);
                auVar68 = vfmadd213ss_avx512f(auVar68,auVar67,auVar62);
                auVar62 = auVar68;
              }
              else {
                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                vucomiss_avx512f(auVar68);
                if ((bVar46) || (auVar62 = ZEXT416(0x3f800000), bVar47)) {
                  auVar68 = ZEXT416(0x7f800000);
                  auVar62 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar66 = vminss_avx512f(auVar66,auVar68);
              auVar63 = vmaxss_avx(auVar62,auVar63);
            }
            auVar263 = ZEXT464(0x3f800000);
            in_ZMM16 = ZEXT1664(auVar3);
            uVar13 = vcmpss_avx512f(auVar61,auVar67,1);
            bVar49 = (bool)((byte)uVar13 & 1);
            auVar61 = auVar263._0_16_;
            fVar220 = (float)((uint)bVar49 * -0x40800000 + (uint)!bVar49 * 0x3f800000);
            if ((auVar102._0_4_ != fVar220) || (NAN(auVar102._0_4_) || NAN(fVar220))) {
              if ((fVar219 != fVar210) || (NAN(fVar219) || NAN(fVar210))) {
                auVar51 = vxorps_avx512vl(auVar51,auVar257._0_16_);
                auVar196._0_4_ = auVar51._0_4_ / (fVar219 - fVar210);
                auVar196._4_12_ = auVar51._4_12_;
                auVar51 = vsubss_avx512f(auVar61,auVar196);
                auVar51 = vfmadd213ss_avx512f(auVar51,auVar67,auVar196);
                auVar62 = auVar51;
              }
              else if ((fVar210 != 0.0) ||
                      (auVar51 = auVar61, auVar62 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar210))) {
                auVar51 = SUB6416(ZEXT464(0xff800000),0);
                auVar62 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar66 = vminss_avx(auVar66,auVar62);
              auVar63 = vmaxss_avx(auVar51,auVar63);
            }
            bVar49 = auVar108._0_4_ != fVar220;
            auVar51 = vminss_avx512f(auVar66,auVar61);
            auVar111._16_16_ = auVar114._16_16_;
            auVar111._0_16_ = auVar66;
            auVar110._4_28_ = auVar111._4_28_;
            auVar110._0_4_ = (uint)bVar49 * auVar51._0_4_ + (uint)!bVar49 * auVar66._0_4_;
            auVar51 = vmaxss_avx512f(auVar61,auVar63);
            auVar113._16_16_ = auVar114._16_16_;
            auVar113._0_16_ = auVar63;
            auVar112._4_28_ = auVar113._4_28_;
            auVar112._0_4_ = (uint)bVar49 * auVar51._0_4_ + (uint)!bVar49 * auVar63._0_4_;
            auVar51 = vmaxss_avx512f(auVar67,auVar110._0_16_);
            auVar114._0_16_ = vminss_avx512f(auVar112._0_16_,auVar61);
            if (auVar51._0_4_ <= auVar114._0_4_) {
              auVar68 = vmaxss_avx512f(auVar67,ZEXT416((uint)(auVar51._0_4_ + -0.1)));
              auVar69 = vminss_avx512f(ZEXT416((uint)(auVar114._0_4_ + 0.1)),auVar61);
              auVar145._0_8_ = auVar166._0_8_;
              auVar145._8_8_ = auVar145._0_8_;
              auVar213._8_8_ = auVar175._0_8_;
              auVar213._0_8_ = auVar175._0_8_;
              auVar224._8_8_ = auVar70._0_8_;
              auVar224._0_8_ = auVar70._0_8_;
              auVar51 = vshufpd_avx(auVar175,auVar175,3);
              auVar62 = vshufpd_avx(auVar70,auVar70,3);
              auVar63 = vshufps_avx(auVar68,auVar69,0);
              auVar67 = vsubps_avx512vl(auVar55,auVar63);
              fVar210 = auVar63._0_4_;
              auVar169._0_4_ = fVar210 * auVar71._0_4_;
              fVar219 = auVar63._4_4_;
              auVar169._4_4_ = fVar219 * auVar71._4_4_;
              fVar220 = auVar63._8_4_;
              auVar169._8_4_ = fVar220 * auVar71._8_4_;
              fVar221 = auVar63._12_4_;
              auVar169._12_4_ = fVar221 * auVar71._12_4_;
              auVar176._0_4_ = fVar210 * auVar51._0_4_;
              auVar176._4_4_ = fVar219 * auVar51._4_4_;
              auVar176._8_4_ = fVar220 * auVar51._8_4_;
              auVar176._12_4_ = fVar221 * auVar51._12_4_;
              auVar248._0_4_ = auVar62._0_4_ * fVar210;
              auVar248._4_4_ = auVar62._4_4_ * fVar219;
              auVar248._8_4_ = auVar62._8_4_ * fVar220;
              auVar248._12_4_ = auVar62._12_4_ * fVar221;
              auVar160._0_4_ = fVar210 * auVar72._0_4_;
              auVar160._4_4_ = fVar219 * auVar72._4_4_;
              auVar160._8_4_ = fVar220 * auVar72._8_4_;
              auVar160._12_4_ = fVar221 * auVar72._12_4_;
              auVar71 = vfmadd231ps_fma(auVar169,auVar67,auVar145);
              auVar72 = vfmadd231ps_fma(auVar176,auVar67,auVar213);
              auVar66 = vfmadd231ps_fma(auVar248,auVar67,auVar224);
              auVar67 = vfmadd231ps_fma(auVar160,auVar67,ZEXT816(0));
              auVar62 = vsubss_avx512f(auVar61,auVar68);
              auVar51 = vmovshdup_avx(auVar58);
              auVar166 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar68._0_4_)),auVar58,
                                         auVar62);
              auVar62 = vsubss_avx512f(auVar61,auVar69);
              auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar69._0_4_)),auVar58,
                                        auVar62);
              auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)fVar120));
              auVar51 = vsubps_avx(auVar72,auVar71);
              auVar173 = auVar254._0_16_;
              auVar62 = vmulps_avx512vl(auVar51,auVar173);
              auVar51 = vsubps_avx(auVar66,auVar72);
              auVar63 = vmulps_avx512vl(auVar51,auVar173);
              auVar51 = vsubps_avx(auVar67,auVar66);
              auVar51 = vmulps_avx512vl(auVar51,auVar173);
              auVar58 = vminps_avx(auVar63,auVar51);
              auVar51 = vmaxps_avx(auVar63,auVar51);
              auVar58 = vminps_avx(auVar62,auVar58);
              auVar51 = vmaxps_avx(auVar62,auVar51);
              auVar62 = vshufpd_avx(auVar58,auVar58,3);
              auVar63 = vshufpd_avx(auVar51,auVar51,3);
              auVar58 = vminps_avx(auVar58,auVar62);
              auVar51 = vmaxps_avx(auVar51,auVar63);
              fVar120 = auVar70._0_4_;
              auVar197._0_4_ = auVar58._0_4_ * fVar120;
              auVar197._4_4_ = auVar58._4_4_ * fVar120;
              auVar197._8_4_ = auVar58._8_4_ * fVar120;
              auVar197._12_4_ = auVar58._12_4_ * fVar120;
              auVar184._0_4_ = fVar120 * auVar51._0_4_;
              auVar184._4_4_ = fVar120 * auVar51._4_4_;
              auVar184._8_4_ = fVar120 * auVar51._8_4_;
              auVar184._12_4_ = fVar120 * auVar51._12_4_;
              auVar70 = vdivss_avx512f(auVar61,ZEXT416((uint)(auVar64._0_4_ - auVar166._0_4_)));
              auVar51 = vshufpd_avx(auVar71,auVar71,3);
              auVar58 = vshufpd_avx(auVar72,auVar72,3);
              auVar62 = vshufpd_avx(auVar66,auVar66,3);
              auVar63 = vshufpd_avx(auVar67,auVar67,3);
              auVar51 = vsubps_avx(auVar51,auVar71);
              auVar71 = vsubps_avx(auVar58,auVar72);
              auVar72 = vsubps_avx(auVar62,auVar66);
              auVar63 = vsubps_avx(auVar63,auVar67);
              auVar58 = vminps_avx(auVar51,auVar71);
              auVar51 = vmaxps_avx(auVar51,auVar71);
              auVar62 = vminps_avx(auVar72,auVar63);
              auVar62 = vminps_avx(auVar58,auVar62);
              auVar58 = vmaxps_avx(auVar72,auVar63);
              auVar51 = vmaxps_avx(auVar51,auVar58);
              fVar120 = auVar70._0_4_;
              auVar225._0_4_ = fVar120 * auVar62._0_4_;
              auVar225._4_4_ = fVar120 * auVar62._4_4_;
              auVar225._8_4_ = fVar120 * auVar62._8_4_;
              auVar225._12_4_ = fVar120 * auVar62._12_4_;
              auVar214._0_4_ = fVar120 * auVar51._0_4_;
              auVar214._4_4_ = fVar120 * auVar51._4_4_;
              auVar214._8_4_ = fVar120 * auVar51._8_4_;
              auVar214._12_4_ = fVar120 * auVar51._12_4_;
              auVar63 = vinsertps_avx(auVar54,auVar166,0x10);
              auVar65 = vpermt2ps_avx512vl(auVar54,_DAT_01feecd0,auVar64);
              auVar133._0_4_ = auVar63._0_4_ + auVar65._0_4_;
              auVar133._4_4_ = auVar63._4_4_ + auVar65._4_4_;
              auVar133._8_4_ = auVar63._8_4_ + auVar65._8_4_;
              auVar133._12_4_ = auVar63._12_4_ + auVar65._12_4_;
              auVar17._8_4_ = 0x3f000000;
              auVar17._0_8_ = 0x3f0000003f000000;
              auVar17._12_4_ = 0x3f000000;
              auVar70 = vmulps_avx512vl(auVar133,auVar17);
              auVar58 = vshufps_avx(auVar70,auVar70,0x54);
              uVar130 = auVar70._0_4_;
              auVar138._4_4_ = uVar130;
              auVar138._0_4_ = uVar130;
              auVar138._8_4_ = uVar130;
              auVar138._12_4_ = uVar130;
              auVar71 = vfmadd213ps_avx512vl(auVar50,auVar138,auVar3);
              auVar72 = vfmadd213ps_avx512vl(auVar101._0_16_,auVar138,auVar59);
              auVar62 = vfmadd213ps_fma(local_2b0,auVar138,local_440);
              auVar51 = vsubps_avx(auVar72,auVar71);
              auVar71 = vfmadd213ps_fma(auVar51,auVar138,auVar71);
              auVar51 = vsubps_avx(auVar62,auVar72);
              auVar51 = vfmadd213ps_fma(auVar51,auVar138,auVar72);
              auVar51 = vsubps_avx(auVar51,auVar71);
              auVar62 = vfmadd231ps_fma(auVar71,auVar51,auVar138);
              auVar66 = vmulps_avx512vl(auVar51,auVar173);
              auVar236._8_8_ = auVar62._0_8_;
              auVar236._0_8_ = auVar62._0_8_;
              auVar51 = vshufpd_avx(auVar62,auVar62,3);
              auVar62 = vshufps_avx(auVar70,auVar70,0x55);
              auVar71 = vsubps_avx(auVar51,auVar236);
              auVar72 = vfmadd231ps_fma(auVar236,auVar62,auVar71);
              auVar249._8_8_ = auVar66._0_8_;
              auVar249._0_8_ = auVar66._0_8_;
              auVar51 = vshufpd_avx(auVar66,auVar66,3);
              auVar51 = vsubps_avx512vl(auVar51,auVar249);
              auVar51 = vfmadd213ps_avx512vl(auVar51,auVar62,auVar249);
              auVar139._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar139._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar139._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar62 = vmovshdup_avx512vl(auVar51);
              auVar250._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
              auVar250._8_4_ = auVar62._8_4_ ^ 0x80000000;
              auVar250._12_4_ = auVar62._12_4_ ^ 0x80000000;
              auVar66 = vmovshdup_avx512vl(auVar71);
              auVar67 = vpermt2ps_avx512vl(auVar250,ZEXT416(5),auVar71);
              auVar73 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar262 = ZEXT1664(auVar73);
              auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar71._0_4_)),auVar51,
                                            auVar66);
              auVar71 = vpermt2ps_avx512vl(auVar51,SUB6416(ZEXT464(4),0),auVar139);
              auVar161._0_4_ = auVar62._0_4_;
              auVar161._4_4_ = auVar161._0_4_;
              auVar161._8_4_ = auVar161._0_4_;
              auVar161._12_4_ = auVar161._0_4_;
              auVar51 = vdivps_avx(auVar67,auVar161);
              auVar74 = vdivps_avx512vl(auVar71,auVar161);
              fVar120 = auVar72._0_4_;
              auVar62 = vshufps_avx(auVar72,auVar72,0x55);
              auVar237._0_4_ = fVar120 * auVar51._0_4_ + auVar62._0_4_ * auVar74._0_4_;
              auVar237._4_4_ = fVar120 * auVar51._4_4_ + auVar62._4_4_ * auVar74._4_4_;
              auVar237._8_4_ = fVar120 * auVar51._8_4_ + auVar62._8_4_ * auVar74._8_4_;
              auVar237._12_4_ = fVar120 * auVar51._12_4_ + auVar62._12_4_ * auVar74._12_4_;
              auVar68 = vsubps_avx(auVar58,auVar237);
              auVar62 = vmovshdup_avx(auVar51);
              auVar58 = vinsertps_avx(auVar197,auVar225,0x1c);
              auVar251._0_4_ = auVar62._0_4_ * auVar58._0_4_;
              auVar251._4_4_ = auVar62._4_4_ * auVar58._4_4_;
              auVar251._8_4_ = auVar62._8_4_ * auVar58._8_4_;
              auVar251._12_4_ = auVar62._12_4_ * auVar58._12_4_;
              auVar69 = vinsertps_avx512f(auVar184,auVar214,0x1c);
              auVar62 = vmulps_avx512vl(auVar62,auVar69);
              auVar67 = vminps_avx512vl(auVar251,auVar62);
              auVar72 = vmaxps_avx(auVar62,auVar251);
              auVar66 = vmovshdup_avx(auVar74);
              auVar62 = vinsertps_avx(auVar225,auVar197,0x4c);
              auVar226._0_4_ = auVar66._0_4_ * auVar62._0_4_;
              auVar226._4_4_ = auVar66._4_4_ * auVar62._4_4_;
              auVar226._8_4_ = auVar66._8_4_ * auVar62._8_4_;
              auVar226._12_4_ = auVar66._12_4_ * auVar62._12_4_;
              auVar71 = vinsertps_avx(auVar214,auVar184,0x4c);
              auVar215._0_4_ = auVar66._0_4_ * auVar71._0_4_;
              auVar215._4_4_ = auVar66._4_4_ * auVar71._4_4_;
              auVar215._8_4_ = auVar66._8_4_ * auVar71._8_4_;
              auVar215._12_4_ = auVar66._12_4_ * auVar71._12_4_;
              auVar66 = vminps_avx(auVar226,auVar215);
              auVar67 = vaddps_avx512vl(auVar67,auVar66);
              auVar66 = vmaxps_avx(auVar215,auVar226);
              auVar216._0_4_ = auVar72._0_4_ + auVar66._0_4_;
              auVar216._4_4_ = auVar72._4_4_ + auVar66._4_4_;
              auVar216._8_4_ = auVar72._8_4_ + auVar66._8_4_;
              auVar216._12_4_ = auVar72._12_4_ + auVar66._12_4_;
              auVar227._8_8_ = 0x3f80000000000000;
              auVar227._0_8_ = 0x3f80000000000000;
              auVar72 = vsubps_avx(auVar227,auVar216);
              auVar66 = vsubps_avx(auVar227,auVar67);
              auVar67 = vsubps_avx(auVar63,auVar70);
              auVar70 = vsubps_avx(auVar65,auVar70);
              fVar221 = auVar67._0_4_;
              auVar252._0_4_ = fVar221 * auVar72._0_4_;
              fVar231 = auVar67._4_4_;
              auVar252._4_4_ = fVar231 * auVar72._4_4_;
              fVar232 = auVar67._8_4_;
              auVar252._8_4_ = fVar232 * auVar72._8_4_;
              fVar233 = auVar67._12_4_;
              auVar252._12_4_ = fVar233 * auVar72._12_4_;
              auVar75 = vbroadcastss_avx512vl(auVar51);
              auVar58 = vmulps_avx512vl(auVar75,auVar58);
              auVar69 = vmulps_avx512vl(auVar75,auVar69);
              auVar75 = vminps_avx512vl(auVar58,auVar69);
              auVar69 = vmaxps_avx512vl(auVar69,auVar58);
              auVar58 = vbroadcastss_avx512vl(auVar74);
              auVar62 = vmulps_avx512vl(auVar58,auVar62);
              auVar58 = vmulps_avx512vl(auVar58,auVar71);
              auVar71 = vminps_avx512vl(auVar62,auVar58);
              auVar71 = vaddps_avx512vl(auVar75,auVar71);
              auVar67 = vmulps_avx512vl(auVar67,auVar66);
              fVar120 = auVar70._0_4_;
              auVar217._0_4_ = fVar120 * auVar72._0_4_;
              fVar210 = auVar70._4_4_;
              auVar217._4_4_ = fVar210 * auVar72._4_4_;
              fVar219 = auVar70._8_4_;
              auVar217._8_4_ = fVar219 * auVar72._8_4_;
              fVar220 = auVar70._12_4_;
              auVar217._12_4_ = fVar220 * auVar72._12_4_;
              auVar228._0_4_ = fVar120 * auVar66._0_4_;
              auVar228._4_4_ = fVar210 * auVar66._4_4_;
              auVar228._8_4_ = fVar219 * auVar66._8_4_;
              auVar228._12_4_ = fVar220 * auVar66._12_4_;
              auVar58 = vmaxps_avx(auVar58,auVar62);
              auVar185._0_4_ = auVar69._0_4_ + auVar58._0_4_;
              auVar185._4_4_ = auVar69._4_4_ + auVar58._4_4_;
              auVar185._8_4_ = auVar69._8_4_ + auVar58._8_4_;
              auVar185._12_4_ = auVar69._12_4_ + auVar58._12_4_;
              auVar198._8_8_ = 0x3f800000;
              auVar198._0_8_ = 0x3f800000;
              auVar58 = vsubps_avx(auVar198,auVar185);
              auVar62 = vsubps_avx512vl(auVar198,auVar71);
              auVar245._0_4_ = fVar221 * auVar58._0_4_;
              auVar245._4_4_ = fVar231 * auVar58._4_4_;
              auVar245._8_4_ = fVar232 * auVar58._8_4_;
              auVar245._12_4_ = fVar233 * auVar58._12_4_;
              auVar238._0_4_ = fVar221 * auVar62._0_4_;
              auVar238._4_4_ = fVar231 * auVar62._4_4_;
              auVar238._8_4_ = fVar232 * auVar62._8_4_;
              auVar238._12_4_ = fVar233 * auVar62._12_4_;
              auVar186._0_4_ = fVar120 * auVar58._0_4_;
              auVar186._4_4_ = fVar210 * auVar58._4_4_;
              auVar186._8_4_ = fVar219 * auVar58._8_4_;
              auVar186._12_4_ = fVar220 * auVar58._12_4_;
              auVar199._0_4_ = fVar120 * auVar62._0_4_;
              auVar199._4_4_ = fVar210 * auVar62._4_4_;
              auVar199._8_4_ = fVar219 * auVar62._8_4_;
              auVar199._12_4_ = fVar220 * auVar62._12_4_;
              auVar58 = vminps_avx(auVar245,auVar238);
              auVar62 = vminps_avx512vl(auVar186,auVar199);
              in_ZMM16 = ZEXT1664(auVar62);
              auVar71 = vminps_avx512vl(auVar58,auVar62);
              auVar58 = vmaxps_avx(auVar238,auVar245);
              auVar62 = vmaxps_avx(auVar199,auVar186);
              auVar62 = vmaxps_avx(auVar62,auVar58);
              auVar72 = vminps_avx512vl(auVar252,auVar67);
              auVar58 = vminps_avx(auVar217,auVar228);
              auVar58 = vminps_avx(auVar72,auVar58);
              auVar58 = vhaddps_avx(auVar71,auVar58);
              auVar114._0_16_ = vmaxps_avx512vl(auVar67,auVar252);
              auVar71 = vmaxps_avx(auVar228,auVar217);
              auVar71 = vmaxps_avx(auVar71,auVar114._0_16_);
              auVar62 = vhaddps_avx(auVar62,auVar71);
              auVar58 = vshufps_avx(auVar58,auVar58,0xe8);
              auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
              auVar187._0_4_ = auVar58._0_4_ + auVar68._0_4_;
              auVar187._4_4_ = auVar58._4_4_ + auVar68._4_4_;
              auVar187._8_4_ = auVar58._8_4_ + auVar68._8_4_;
              auVar187._12_4_ = auVar58._12_4_ + auVar68._12_4_;
              auVar200._0_4_ = auVar62._0_4_ + auVar68._0_4_;
              auVar200._4_4_ = auVar62._4_4_ + auVar68._4_4_;
              auVar200._8_4_ = auVar62._8_4_ + auVar68._8_4_;
              auVar200._12_4_ = auVar62._12_4_ + auVar68._12_4_;
              auVar58 = vmaxps_avx(auVar63,auVar187);
              auVar62 = vminps_avx(auVar200,auVar65);
              uVar42 = vcmpps_avx512vl(auVar62,auVar58,1);
              if ((uVar42 & 3) == 0) {
                uVar42 = vcmpps_avx512vl(auVar200,auVar65,1);
                uVar13 = vcmpps_avx512vl(auVar54,auVar187,1);
                if (((ushort)uVar13 & (ushort)uVar42 & 1) == 0) {
                  bVar36 = 0;
                }
                else {
                  auVar58 = vmovshdup_avx(auVar187);
                  bVar36 = auVar166._0_4_ < auVar58._0_4_ & (byte)(uVar42 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar38 || uVar119 != 0 && !bVar48) | bVar36) != 1) {
                  auVar58 = vinsertps_avx(auVar166,auVar64,0x10);
                  goto LAB_01d01817;
                }
                lVar40 = 200;
                do {
                  auVar54 = vsubss_avx512f(auVar61,auVar68);
                  fVar219 = auVar54._0_4_;
                  fVar120 = fVar219 * fVar219 * fVar219;
                  fVar220 = auVar68._0_4_;
                  fVar210 = fVar220 * 3.0 * fVar219 * fVar219;
                  fVar219 = fVar219 * fVar220 * fVar220 * 3.0;
                  auVar152._4_4_ = fVar120;
                  auVar152._0_4_ = fVar120;
                  auVar152._8_4_ = fVar120;
                  auVar152._12_4_ = fVar120;
                  auVar146._4_4_ = fVar210;
                  auVar146._0_4_ = fVar210;
                  auVar146._8_4_ = fVar210;
                  auVar146._12_4_ = fVar210;
                  auVar123._4_4_ = fVar219;
                  auVar123._0_4_ = fVar219;
                  auVar123._8_4_ = fVar219;
                  auVar123._12_4_ = fVar219;
                  fVar220 = fVar220 * fVar220 * fVar220;
                  auVar170._0_4_ = fVar220 * (float)local_290._0_4_;
                  auVar170._4_4_ = fVar220 * (float)local_290._4_4_;
                  auVar170._8_4_ = fVar220 * fStack_288;
                  auVar170._12_4_ = fVar220 * fStack_284;
                  auVar54 = vfmadd231ps_fma(auVar170,local_440,auVar123);
                  auVar54 = vfmadd231ps_fma(auVar54,auVar59,auVar146);
                  auVar54 = vfmadd231ps_fma(auVar54,auVar3,auVar152);
                  auVar124._8_8_ = auVar54._0_8_;
                  auVar124._0_8_ = auVar54._0_8_;
                  auVar54 = vshufpd_avx(auVar54,auVar54,3);
                  auVar58 = vshufps_avx(auVar68,auVar68,0x55);
                  auVar54 = vsubps_avx(auVar54,auVar124);
                  auVar58 = vfmadd213ps_fma(auVar54,auVar58,auVar124);
                  fVar120 = auVar58._0_4_;
                  auVar54 = vshufps_avx(auVar58,auVar58,0x55);
                  auVar125._0_4_ = auVar51._0_4_ * fVar120 + auVar74._0_4_ * auVar54._0_4_;
                  auVar125._4_4_ = auVar51._4_4_ * fVar120 + auVar74._4_4_ * auVar54._4_4_;
                  auVar125._8_4_ = auVar51._8_4_ * fVar120 + auVar74._8_4_ * auVar54._8_4_;
                  auVar125._12_4_ = auVar51._12_4_ * fVar120 + auVar74._12_4_ * auVar54._12_4_;
                  auVar68 = vsubps_avx(auVar68,auVar125);
                  auVar54 = vandps_avx512vl(auVar58,auVar256._0_16_);
                  auVar114._0_16_ = vprolq_avx512vl(auVar54,0x20);
                  auVar54 = vmaxss_avx(auVar114._0_16_,auVar54);
                  bVar48 = (float)local_2a0._0_4_ < auVar54._0_4_;
                  if (auVar54._0_4_ < (float)local_2a0._0_4_) {
                    auVar54 = vucomiss_avx512f(auVar73);
                    if (bVar48) break;
                    auVar51 = vucomiss_avx512f(auVar54);
                    auVar263 = ZEXT1664(auVar51);
                    if (bVar48) break;
                    vmovshdup_avx(auVar54);
                    auVar51 = vucomiss_avx512f(auVar73);
                    if (bVar48) break;
                    auVar58 = vucomiss_avx512f(auVar51);
                    auVar263 = ZEXT1664(auVar58);
                    if (bVar48) break;
                    auVar61 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar70 = vinsertps_avx(auVar61,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar61 = vdpps_avx(auVar70,local_2c0,0x7f);
                    auVar62 = vdpps_avx(auVar70,local_2d0,0x7f);
                    auVar63 = vdpps_avx(auVar70,local_2e0,0x7f);
                    auVar71 = vdpps_avx(auVar70,local_2f0,0x7f);
                    auVar72 = vdpps_avx(auVar70,local_300,0x7f);
                    auVar66 = vdpps_avx(auVar70,local_310,0x7f);
                    auVar67 = vdpps_avx(auVar70,local_320,0x7f);
                    auVar70 = vdpps_avx(auVar70,local_330,0x7f);
                    auVar68 = vsubss_avx512f(auVar58,auVar51);
                    fVar220 = auVar51._0_4_;
                    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar72._0_4_)),auVar68,
                                              auVar61);
                    auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar220)),auVar68,
                                              auVar62);
                    auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar220)),auVar68,
                                              auVar63);
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar70._0_4_)),auVar68,
                                              auVar71);
                    auVar114._0_16_ = vsubss_avx512f(auVar58,auVar54);
                    auVar177._0_4_ = auVar114._0_4_;
                    fVar120 = auVar177._0_4_ * auVar177._0_4_ * auVar177._0_4_;
                    local_120 = auVar54._0_4_;
                    fVar210 = local_120 * 3.0 * auVar177._0_4_ * auVar177._0_4_;
                    fVar219 = auVar177._0_4_ * local_120 * local_120 * 3.0;
                    fVar231 = local_120 * local_120 * local_120;
                    auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * auVar63._0_4_)),
                                              ZEXT416((uint)fVar219),auVar62);
                    auVar58 = vfmadd231ss_fma(auVar58,ZEXT416((uint)fVar210),auVar61);
                    auVar51 = vfmadd231ss_fma(auVar58,ZEXT416((uint)fVar120),auVar51);
                    fVar221 = auVar51._0_4_;
                    if ((fVar221 < fVar143) ||
                       (fVar232 = *(float *)(ray + k * 4 + 0x100), fVar232 < fVar221)) break;
                    auVar51 = vshufps_avx(auVar54,auVar54,0x55);
                    auVar61 = vsubps_avx512vl(auVar55,auVar51);
                    fVar233 = auVar51._0_4_;
                    auVar206._0_4_ = fVar233 * (float)local_350._0_4_;
                    fVar234 = auVar51._4_4_;
                    auVar206._4_4_ = fVar234 * (float)local_350._4_4_;
                    fVar240 = auVar51._8_4_;
                    auVar206._8_4_ = fVar240 * fStack_348;
                    fVar241 = auVar51._12_4_;
                    auVar206._12_4_ = fVar241 * fStack_344;
                    auVar218._0_4_ = fVar233 * (float)local_3a0._0_4_;
                    auVar218._4_4_ = fVar234 * (float)local_3a0._4_4_;
                    auVar218._8_4_ = fVar240 * fStack_398;
                    auVar218._12_4_ = fVar241 * fStack_394;
                    auVar229._0_4_ = fVar233 * (float)local_3b0._0_4_;
                    auVar229._4_4_ = fVar234 * (float)local_3b0._4_4_;
                    auVar229._8_4_ = fVar240 * fStack_3a8;
                    auVar229._12_4_ = fVar241 * fStack_3a4;
                    auVar188._0_4_ = fVar233 * (float)local_370._0_4_;
                    auVar188._4_4_ = fVar234 * (float)local_370._4_4_;
                    auVar188._8_4_ = fVar240 * fStack_368;
                    auVar188._12_4_ = fVar241 * fStack_364;
                    auVar51 = vfmadd231ps_fma(auVar206,auVar61,local_340);
                    auVar55 = vfmadd231ps_fma(auVar218,auVar61,local_380);
                    auVar58 = vfmadd231ps_fma(auVar229,auVar61,local_390);
                    auVar61 = vfmadd231ps_fma(auVar188,auVar61,local_360);
                    auVar51 = vsubps_avx(auVar55,auVar51);
                    auVar55 = vsubps_avx(auVar58,auVar55);
                    auVar58 = vsubps_avx(auVar61,auVar58);
                    auVar230._0_4_ = local_120 * auVar55._0_4_;
                    auVar230._4_4_ = local_120 * auVar55._4_4_;
                    auVar230._8_4_ = local_120 * auVar55._8_4_;
                    auVar230._12_4_ = local_120 * auVar55._12_4_;
                    auVar177._4_4_ = auVar177._0_4_;
                    auVar177._8_4_ = auVar177._0_4_;
                    auVar177._12_4_ = auVar177._0_4_;
                    auVar51 = vfmadd231ps_fma(auVar230,auVar177,auVar51);
                    auVar189._0_4_ = local_120 * auVar58._0_4_;
                    auVar189._4_4_ = local_120 * auVar58._4_4_;
                    auVar189._8_4_ = local_120 * auVar58._8_4_;
                    auVar189._12_4_ = local_120 * auVar58._12_4_;
                    auVar55 = vfmadd231ps_fma(auVar189,auVar177,auVar55);
                    auVar190._0_4_ = local_120 * auVar55._0_4_;
                    auVar190._4_4_ = local_120 * auVar55._4_4_;
                    auVar190._8_4_ = local_120 * auVar55._8_4_;
                    auVar190._12_4_ = local_120 * auVar55._12_4_;
                    auVar51 = vfmadd231ps_fma(auVar190,auVar177,auVar51);
                    auVar114._0_16_ = vmulps_avx512vl(auVar51,auVar173);
                    pGVar6 = (context->scene->geometries).items[uVar45].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar171._0_4_ = fVar231 * (float)local_3f0._0_4_;
                    auVar171._4_4_ = fVar231 * (float)local_3f0._4_4_;
                    auVar171._8_4_ = fVar231 * fStack_3e8;
                    auVar171._12_4_ = fVar231 * fStack_3e4;
                    auVar162._4_4_ = fVar219;
                    auVar162._0_4_ = fVar219;
                    auVar162._8_4_ = fVar219;
                    auVar162._12_4_ = fVar219;
                    auVar51 = vfmadd132ps_fma(auVar162,auVar171,local_3e0);
                    auVar153._4_4_ = fVar210;
                    auVar153._0_4_ = fVar210;
                    auVar153._8_4_ = fVar210;
                    auVar153._12_4_ = fVar210;
                    auVar51 = vfmadd132ps_fma(auVar153,auVar51,local_3d0);
                    auVar147._4_4_ = fVar120;
                    auVar147._0_4_ = fVar120;
                    auVar147._8_4_ = fVar120;
                    auVar147._12_4_ = fVar120;
                    auVar58 = vfmadd132ps_fma(auVar147,auVar51,local_3c0);
                    auVar51 = vshufps_avx(auVar58,auVar58,0xc9);
                    auVar55 = vshufps_avx(auVar114._0_16_,auVar114._0_16_,0xc9);
                    auVar148._0_4_ = auVar58._0_4_ * auVar55._0_4_;
                    auVar148._4_4_ = auVar58._4_4_ * auVar55._4_4_;
                    auVar148._8_4_ = auVar58._8_4_ * auVar55._8_4_;
                    auVar148._12_4_ = auVar58._12_4_ * auVar55._12_4_;
                    auVar51 = vfmsub231ps_fma(auVar148,auVar114._0_16_,auVar51);
                    local_140 = auVar51._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar221;
                      uVar130 = vextractps_avx(auVar51,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar130;
                      uVar130 = vextractps_avx(auVar51,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar130;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                      *(float *)(ray + k * 4 + 0x1e0) = local_120;
                      *(float *)(ray + k * 4 + 0x200) = fVar220;
                      *(uint *)(ray + k * 4 + 0x220) = uVar5;
                      *(uint *)(ray + k * 4 + 0x240) = uVar45;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auVar156._8_4_ = 1;
                    auVar156._0_8_ = 0x100000001;
                    auVar156._12_4_ = 1;
                    auVar156._16_4_ = 1;
                    auVar156._20_4_ = 1;
                    auVar156._24_4_ = 1;
                    auVar156._28_4_ = 1;
                    local_100 = vpermps_avx2(auVar156,ZEXT1632(auVar54));
                    auVar81 = vpermps_avx2(auVar156,ZEXT1632(auVar51));
                    auVar114 = vpermps_avx512vl(auVar261._0_32_,ZEXT1632(auVar51));
                    local_180[0] = (RTCHitN)auVar81[0];
                    local_180[1] = (RTCHitN)auVar81[1];
                    local_180[2] = (RTCHitN)auVar81[2];
                    local_180[3] = (RTCHitN)auVar81[3];
                    local_180[4] = (RTCHitN)auVar81[4];
                    local_180[5] = (RTCHitN)auVar81[5];
                    local_180[6] = (RTCHitN)auVar81[6];
                    local_180[7] = (RTCHitN)auVar81[7];
                    local_180[8] = (RTCHitN)auVar81[8];
                    local_180[9] = (RTCHitN)auVar81[9];
                    local_180[10] = (RTCHitN)auVar81[10];
                    local_180[0xb] = (RTCHitN)auVar81[0xb];
                    local_180[0xc] = (RTCHitN)auVar81[0xc];
                    local_180[0xd] = (RTCHitN)auVar81[0xd];
                    local_180[0xe] = (RTCHitN)auVar81[0xe];
                    local_180[0xf] = (RTCHitN)auVar81[0xf];
                    local_180[0x10] = (RTCHitN)auVar81[0x10];
                    local_180[0x11] = (RTCHitN)auVar81[0x11];
                    local_180[0x12] = (RTCHitN)auVar81[0x12];
                    local_180[0x13] = (RTCHitN)auVar81[0x13];
                    local_180[0x14] = (RTCHitN)auVar81[0x14];
                    local_180[0x15] = (RTCHitN)auVar81[0x15];
                    local_180[0x16] = (RTCHitN)auVar81[0x16];
                    local_180[0x17] = (RTCHitN)auVar81[0x17];
                    local_180[0x18] = (RTCHitN)auVar81[0x18];
                    local_180[0x19] = (RTCHitN)auVar81[0x19];
                    local_180[0x1a] = (RTCHitN)auVar81[0x1a];
                    local_180[0x1b] = (RTCHitN)auVar81[0x1b];
                    local_180[0x1c] = (RTCHitN)auVar81[0x1c];
                    local_180[0x1d] = (RTCHitN)auVar81[0x1d];
                    local_180[0x1e] = (RTCHitN)auVar81[0x1e];
                    local_180[0x1f] = (RTCHitN)auVar81[0x1f];
                    local_160 = auVar114;
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    fStack_11c = local_120;
                    fStack_118 = local_120;
                    fStack_114 = local_120;
                    fStack_110 = local_120;
                    fStack_10c = local_120;
                    fStack_108 = local_120;
                    fStack_104 = local_120;
                    local_e0 = local_200._0_8_;
                    uStack_d8 = local_200._8_8_;
                    uStack_d0 = local_200._16_8_;
                    uStack_c8 = local_200._24_8_;
                    local_c0 = local_1e0;
                    vpcmpeqd_avx2(local_1e0,local_1e0);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar221;
                    local_420 = local_220;
                    local_470.valid = (int *)local_420;
                    local_470.geometryUserPtr = pGVar6->userPtr;
                    local_470.context = context->user;
                    local_470.hit = local_180;
                    local_470.N = 8;
                    local_470.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&local_470);
                      auVar54 = vxorps_avx512vl(auVar73,auVar73);
                      auVar262 = ZEXT1664(auVar54);
                      auVar263 = ZEXT464(0x3f800000);
                      auVar260 = ZEXT3264(_DAT_01feed20);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar259 = ZEXT1664(auVar54);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar258 = ZEXT1664(auVar54);
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar255 = ZEXT3264(auVar81);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar257 = ZEXT1664(auVar54);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar256 = ZEXT1664(auVar54);
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar254 = ZEXT1664(auVar54);
                      auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar261 = ZEXT3264(auVar114);
                    }
                    auVar54 = auVar262._0_16_;
                    if (local_420 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_470);
                        auVar54 = vxorps_avx512vl(auVar54,auVar54);
                        auVar262 = ZEXT1664(auVar54);
                        auVar263 = ZEXT464(0x3f800000);
                        auVar260 = ZEXT3264(_DAT_01feed20);
                        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar259 = ZEXT1664(auVar54);
                        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar258 = ZEXT1664(auVar54);
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar255 = ZEXT3264(auVar81);
                        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar257 = ZEXT1664(auVar54);
                        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar256 = ZEXT1664(auVar54);
                        auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar254 = ZEXT1664(auVar54);
                        auVar114 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar261 = ZEXT3264(auVar114);
                      }
                      if (local_420 != (undefined1  [32])0x0) {
                        uVar42 = vptestmd_avx512vl(local_420,local_420);
                        iVar29 = *(int *)(local_470.hit + 4);
                        iVar30 = *(int *)(local_470.hit + 8);
                        iVar31 = *(int *)(local_470.hit + 0xc);
                        iVar32 = *(int *)(local_470.hit + 0x10);
                        iVar33 = *(int *)(local_470.hit + 0x14);
                        iVar34 = *(int *)(local_470.hit + 0x18);
                        iVar35 = *(int *)(local_470.hit + 0x1c);
                        bVar36 = (byte)uVar42;
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar49 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar12 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_470.ray + 0x180) =
                             (uint)(bVar36 & 1) * *(int *)local_470.hit |
                             (uint)!(bool)(bVar36 & 1) * *(int *)(local_470.ray + 0x180);
                        *(uint *)(local_470.ray + 0x184) =
                             (uint)bVar48 * iVar29 | (uint)!bVar48 * *(int *)(local_470.ray + 0x184)
                        ;
                        *(uint *)(local_470.ray + 0x188) =
                             (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_470.ray + 0x188)
                        ;
                        *(uint *)(local_470.ray + 0x18c) =
                             (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_470.ray + 0x18c)
                        ;
                        *(uint *)(local_470.ray + 400) =
                             (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_470.ray + 400);
                        *(uint *)(local_470.ray + 0x194) =
                             (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_470.ray + 0x194)
                        ;
                        *(uint *)(local_470.ray + 0x198) =
                             (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_470.ray + 0x198)
                        ;
                        *(uint *)(local_470.ray + 0x19c) =
                             (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_470.ray + 0x19c)
                        ;
                        iVar29 = *(int *)(local_470.hit + 0x24);
                        iVar30 = *(int *)(local_470.hit + 0x28);
                        iVar31 = *(int *)(local_470.hit + 0x2c);
                        iVar32 = *(int *)(local_470.hit + 0x30);
                        iVar33 = *(int *)(local_470.hit + 0x34);
                        iVar34 = *(int *)(local_470.hit + 0x38);
                        iVar35 = *(int *)(local_470.hit + 0x3c);
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar49 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar12 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_470.ray + 0x1a0) =
                             (uint)(bVar36 & 1) * *(int *)(local_470.hit + 0x20) |
                             (uint)!(bool)(bVar36 & 1) * *(int *)(local_470.ray + 0x1a0);
                        *(uint *)(local_470.ray + 0x1a4) =
                             (uint)bVar48 * iVar29 | (uint)!bVar48 * *(int *)(local_470.ray + 0x1a4)
                        ;
                        *(uint *)(local_470.ray + 0x1a8) =
                             (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_470.ray + 0x1a8)
                        ;
                        *(uint *)(local_470.ray + 0x1ac) =
                             (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_470.ray + 0x1ac)
                        ;
                        *(uint *)(local_470.ray + 0x1b0) =
                             (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_470.ray + 0x1b0)
                        ;
                        *(uint *)(local_470.ray + 0x1b4) =
                             (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_470.ray + 0x1b4)
                        ;
                        *(uint *)(local_470.ray + 0x1b8) =
                             (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_470.ray + 0x1b8)
                        ;
                        *(uint *)(local_470.ray + 0x1bc) =
                             (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_470.ray + 0x1bc)
                        ;
                        iVar29 = *(int *)(local_470.hit + 0x44);
                        iVar30 = *(int *)(local_470.hit + 0x48);
                        iVar31 = *(int *)(local_470.hit + 0x4c);
                        iVar32 = *(int *)(local_470.hit + 0x50);
                        iVar33 = *(int *)(local_470.hit + 0x54);
                        iVar34 = *(int *)(local_470.hit + 0x58);
                        iVar35 = *(int *)(local_470.hit + 0x5c);
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar49 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar12 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_470.ray + 0x1c0) =
                             (uint)(bVar36 & 1) * *(int *)(local_470.hit + 0x40) |
                             (uint)!(bool)(bVar36 & 1) * *(int *)(local_470.ray + 0x1c0);
                        *(uint *)(local_470.ray + 0x1c4) =
                             (uint)bVar48 * iVar29 | (uint)!bVar48 * *(int *)(local_470.ray + 0x1c4)
                        ;
                        *(uint *)(local_470.ray + 0x1c8) =
                             (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_470.ray + 0x1c8)
                        ;
                        *(uint *)(local_470.ray + 0x1cc) =
                             (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_470.ray + 0x1cc)
                        ;
                        *(uint *)(local_470.ray + 0x1d0) =
                             (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_470.ray + 0x1d0)
                        ;
                        *(uint *)(local_470.ray + 0x1d4) =
                             (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_470.ray + 0x1d4)
                        ;
                        *(uint *)(local_470.ray + 0x1d8) =
                             (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_470.ray + 0x1d8)
                        ;
                        *(uint *)(local_470.ray + 0x1dc) =
                             (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_470.ray + 0x1dc)
                        ;
                        iVar29 = *(int *)(local_470.hit + 100);
                        iVar30 = *(int *)(local_470.hit + 0x68);
                        iVar31 = *(int *)(local_470.hit + 0x6c);
                        iVar32 = *(int *)(local_470.hit + 0x70);
                        iVar33 = *(int *)(local_470.hit + 0x74);
                        iVar34 = *(int *)(local_470.hit + 0x78);
                        iVar35 = *(int *)(local_470.hit + 0x7c);
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar49 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
                        bVar47 = (bool)((byte)(uVar42 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar42 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar42 >> 6) & 1);
                        bVar12 = SUB81(uVar42 >> 7,0);
                        *(uint *)(local_470.ray + 0x1e0) =
                             (uint)(bVar36 & 1) * *(int *)(local_470.hit + 0x60) |
                             (uint)!(bool)(bVar36 & 1) * *(int *)(local_470.ray + 0x1e0);
                        *(uint *)(local_470.ray + 0x1e4) =
                             (uint)bVar48 * iVar29 | (uint)!bVar48 * *(int *)(local_470.ray + 0x1e4)
                        ;
                        *(uint *)(local_470.ray + 0x1e8) =
                             (uint)bVar49 * iVar30 | (uint)!bVar49 * *(int *)(local_470.ray + 0x1e8)
                        ;
                        *(uint *)(local_470.ray + 0x1ec) =
                             (uint)bVar46 * iVar31 | (uint)!bVar46 * *(int *)(local_470.ray + 0x1ec)
                        ;
                        *(uint *)(local_470.ray + 0x1f0) =
                             (uint)bVar47 * iVar32 | (uint)!bVar47 * *(int *)(local_470.ray + 0x1f0)
                        ;
                        *(uint *)(local_470.ray + 500) =
                             (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_470.ray + 500);
                        *(uint *)(local_470.ray + 0x1f8) =
                             (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_470.ray + 0x1f8)
                        ;
                        *(uint *)(local_470.ray + 0x1fc) =
                             (uint)bVar12 * iVar35 | (uint)!bVar12 * *(int *)(local_470.ray + 0x1fc)
                        ;
                        iVar29 = *(int *)(local_470.ray + 0x204);
                        iVar30 = *(int *)(local_470.ray + 0x208);
                        iVar31 = *(int *)(local_470.ray + 0x20c);
                        iVar32 = *(int *)(local_470.ray + 0x210);
                        iVar33 = *(int *)(local_470.ray + 0x214);
                        iVar34 = *(int *)(local_470.ray + 0x218);
                        iVar35 = *(int *)(local_470.ray + 0x21c);
                        auVar115._0_4_ =
                             (uint)(bVar36 & 1) * *(int *)(local_470.hit + 0x80) |
                             (uint)!(bool)(bVar36 & 1) * *(int *)(local_470.ray + 0x200);
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        auVar115._4_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x84) | (uint)!bVar48 * iVar29;
                        bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar115._8_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x88) | (uint)!bVar48 * iVar30;
                        bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                        auVar115._12_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x8c) | (uint)!bVar48 * iVar31;
                        bVar48 = (bool)((byte)(uVar42 >> 4) & 1);
                        auVar115._16_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x90) | (uint)!bVar48 * iVar32;
                        bVar48 = (bool)((byte)(uVar42 >> 5) & 1);
                        auVar115._20_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x94) | (uint)!bVar48 * iVar33;
                        bVar48 = (bool)((byte)(uVar42 >> 6) & 1);
                        auVar115._24_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x98) | (uint)!bVar48 * iVar34;
                        bVar48 = SUB81(uVar42 >> 7,0);
                        auVar115._28_4_ =
                             (uint)bVar48 * *(int *)(local_470.hit + 0x9c) | (uint)!bVar48 * iVar35;
                        *(undefined1 (*) [32])(local_470.ray + 0x200) = auVar115;
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        uVar119 = bVar48 * auVar115._4_4_ | (uint)!bVar48 * iVar29;
                        auVar25._4_24_ = auVar115._8_24_;
                        auVar25._0_4_ = uVar119;
                        auVar116._0_8_ = auVar25._0_8_ << 0x20;
                        bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar116._8_4_ = bVar48 * auVar115._8_4_ | (uint)!bVar48 * iVar30;
                        bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                        auVar116._12_4_ = bVar48 * auVar115._12_4_ | (uint)!bVar48 * iVar31;
                        bVar48 = (bool)((byte)(uVar42 >> 4) & 1);
                        auVar116._16_4_ = bVar48 * auVar115._16_4_ | (uint)!bVar48 * iVar32;
                        bVar48 = (bool)((byte)(uVar42 >> 5) & 1);
                        auVar116._20_4_ = bVar48 * auVar115._20_4_ | (uint)!bVar48 * iVar33;
                        bVar48 = (bool)((byte)(uVar42 >> 6) & 1);
                        auVar116._24_4_ = bVar48 * auVar115._24_4_ | (uint)!bVar48 * iVar34;
                        bVar48 = SUB81(uVar42 >> 7,0);
                        auVar116._28_4_ = bVar48 * auVar115._28_4_ | (uint)!bVar48 * iVar35;
                        auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xa0));
                        *(undefined1 (*) [32])(local_470.ray + 0x220) = auVar81;
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        uVar119 = bVar48 * uVar119 | (uint)!bVar48 * iVar29;
                        auVar26._4_24_ = auVar116._8_24_;
                        auVar26._0_4_ = uVar119;
                        auVar117._0_8_ = auVar26._0_8_ << 0x20;
                        bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar117._8_4_ = bVar48 * auVar116._8_4_ | (uint)!bVar48 * iVar30;
                        bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                        auVar117._12_4_ = bVar48 * auVar116._12_4_ | (uint)!bVar48 * iVar31;
                        bVar48 = (bool)((byte)(uVar42 >> 4) & 1);
                        auVar117._16_4_ = bVar48 * auVar116._16_4_ | (uint)!bVar48 * iVar32;
                        bVar48 = (bool)((byte)(uVar42 >> 5) & 1);
                        auVar117._20_4_ = bVar48 * auVar116._20_4_ | (uint)!bVar48 * iVar33;
                        bVar48 = (bool)((byte)(uVar42 >> 6) & 1);
                        auVar117._24_4_ = bVar48 * auVar116._24_4_ | (uint)!bVar48 * iVar34;
                        bVar48 = SUB81(uVar42 >> 7,0);
                        auVar117._28_4_ = bVar48 * auVar116._28_4_ | (uint)!bVar48 * iVar35;
                        auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xc0));
                        *(undefined1 (*) [32])(local_470.ray + 0x240) = auVar81;
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        uVar119 = bVar48 * uVar119 | (uint)!bVar48 * iVar29;
                        auVar27._4_24_ = auVar117._8_24_;
                        auVar27._0_4_ = uVar119;
                        auVar118._0_8_ = auVar27._0_8_ << 0x20;
                        bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar118._8_4_ = bVar48 * auVar117._8_4_ | (uint)!bVar48 * iVar30;
                        bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                        auVar118._12_4_ = bVar48 * auVar117._12_4_ | (uint)!bVar48 * iVar31;
                        bVar48 = (bool)((byte)(uVar42 >> 4) & 1);
                        auVar118._16_4_ = bVar48 * auVar117._16_4_ | (uint)!bVar48 * iVar32;
                        bVar48 = (bool)((byte)(uVar42 >> 5) & 1);
                        auVar118._20_4_ = bVar48 * auVar117._20_4_ | (uint)!bVar48 * iVar33;
                        bVar48 = (bool)((byte)(uVar42 >> 6) & 1);
                        auVar118._24_4_ = bVar48 * auVar117._24_4_ | (uint)!bVar48 * iVar34;
                        bVar48 = SUB81(uVar42 >> 7,0);
                        auVar118._28_4_ = bVar48 * auVar117._28_4_ | (uint)!bVar48 * iVar35;
                        auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xe0));
                        *(undefined1 (*) [32])(local_470.ray + 0x260) = auVar81;
                        bVar48 = (bool)((byte)(uVar42 >> 1) & 1);
                        auVar28._4_24_ = auVar118._8_24_;
                        auVar28._0_4_ = bVar48 * uVar119 | (uint)!bVar48 * iVar29;
                        auVar114._0_8_ = auVar28._0_8_ << 0x20;
                        bVar48 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar114._8_4_ = bVar48 * auVar118._8_4_ | (uint)!bVar48 * iVar30;
                        bVar48 = (bool)((byte)(uVar42 >> 3) & 1);
                        auVar114._12_4_ = bVar48 * auVar118._12_4_ | (uint)!bVar48 * iVar31;
                        bVar48 = (bool)((byte)(uVar42 >> 4) & 1);
                        auVar114._16_4_ = bVar48 * auVar118._16_4_ | (uint)!bVar48 * iVar32;
                        bVar48 = (bool)((byte)(uVar42 >> 5) & 1);
                        auVar114._20_4_ = bVar48 * auVar118._20_4_ | (uint)!bVar48 * iVar33;
                        bVar48 = (bool)((byte)(uVar42 >> 6) & 1);
                        auVar114._24_4_ = bVar48 * auVar118._24_4_ | (uint)!bVar48 * iVar34;
                        bVar48 = SUB81(uVar42 >> 7,0);
                        auVar114._28_4_ = bVar48 * auVar118._28_4_ | (uint)!bVar48 * iVar35;
                        auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0x100));
                        *(undefined1 (*) [32])(local_470.ray + 0x280) = auVar81;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar232;
                    break;
                  }
                  lVar40 = lVar40 + -1;
                } while (lVar40 != 0);
              }
            }
          }
          if ((uint)uVar38 == 0) break;
        } while( true );
      }
      uVar130 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar18._4_4_ = uVar130;
      auVar18._0_4_ = uVar130;
      auVar18._8_4_ = uVar130;
      auVar18._12_4_ = uVar130;
      auVar18._16_4_ = uVar130;
      auVar18._20_4_ = uVar130;
      auVar18._24_4_ = uVar130;
      auVar18._28_4_ = uVar130;
      uVar13 = vcmpps_avx512vl(local_1c0,auVar18,2);
      uVar45 = (uint)uVar44 & local_478 & (uint)uVar13;
      uVar44 = (ulong)uVar45;
    } while (uVar45 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }